

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O3

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar16;
  Command *pCVar17;
  uint8_t *puVar18;
  uint32_t *puVar19;
  long lVar20;
  HistogramLiteral *pHVar21;
  void *pvVar22;
  uint16_t *puVar23;
  HistogramCommand *pHVar24;
  ulong uVar25;
  ushort *puVar26;
  void *pvVar27;
  void *pvVar28;
  void *pvVar29;
  void *pvVar30;
  long lVar31;
  ulong uVar32;
  HistogramDistance *pHVar33;
  uint32_t *puVar34;
  long lVar35;
  long lVar36;
  char *pcVar37;
  byte *pbVar38;
  uint *puVar39;
  size_t sVar40;
  uint *puVar41;
  size_t sVar42;
  HistogramCommand *pHVar43;
  byte bVar44;
  uint uVar45;
  byte bVar46;
  size_t sVar47;
  ulong uVar48;
  uint32_t uVar49;
  size_t __n;
  void *pvVar50;
  uint uVar51;
  size_t __n_00;
  ulong uVar52;
  long lVar53;
  void *pvVar54;
  ulong uVar55;
  ulong uVar56;
  double dVar57;
  int iVar64;
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar65;
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar121;
  int iVar122;
  int iVar129;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  int iVar130;
  undefined1 auVar128 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  HistogramCommand *local_ff8;
  ulong local_ff0;
  void *local_fe8;
  HistogramDistance *local_fe0;
  void *local_fd8;
  uint32_t *local_fd0;
  double local_fc8;
  HistogramDistance *local_fb8;
  uint32_t *local_fb0;
  uint32_t *local_fa8;
  uint32_t *local_f98;
  void *local_f90;
  ulong local_f88;
  HistogramPair *local_f80;
  void *local_f78;
  ulong local_f70;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [2080];
  ulong local_320;
  double local_318;
  ulong local_40;
  double local_38;
  
  if (num_commands == 0) {
    local_fe0 = (HistogramDistance *)0x0;
LAB_001122f6:
    literal_split->num_types = 1;
  }
  else {
    pCVar17 = cmds;
    sVar40 = num_commands;
    sVar47 = 0;
    do {
      sVar42 = sVar47;
      uVar32 = (ulong)pCVar17->insert_len_;
      sVar47 = sVar42 + uVar32;
      pCVar17 = pCVar17 + 1;
      sVar40 = sVar40 - 1;
    } while (sVar40 != 0);
    if (sVar47 == 0) {
      local_fe0 = (HistogramDistance *)0x0;
    }
    else {
      local_fe0 = (HistogramDistance *)BrotliAllocate(m,sVar47);
    }
    puVar19 = &cmds->copy_len_;
    lVar53 = 0;
    sVar40 = num_commands;
    do {
      uVar56 = pos & mask;
      __n_00 = (size_t)((Command *)(puVar19 + -1))->insert_len_;
      if (mask < uVar56 + __n_00) {
        __n = (mask + 1) - uVar56;
        memcpy((void *)((long)local_fe0 + lVar53),data + uVar56,__n);
        lVar53 = lVar53 + __n;
        __n_00 = __n_00 - __n;
        uVar56 = 0;
      }
      if (__n_00 != 0) {
        memcpy((void *)((long)local_fe0 + lVar53),data + uVar56,__n_00);
        lVar53 = lVar53 + __n_00;
      }
      pos = (ulong)(*puVar19 & 0xffffff) + __n_00 + uVar56;
      puVar19 = puVar19 + 4;
      sVar40 = sVar40 - 1;
    } while (sVar40 != 0);
    uVar56 = 100;
    if (sVar47 < 0xd480) {
      uVar56 = (ulong)(((uint)sVar47 & 0xffff) / 0x220 + 1);
    }
    if (sVar47 == 0) goto LAB_001122f6;
    if (sVar47 < 0x80) {
      sVar40 = literal_split->num_blocks;
      uVar56 = literal_split->types_alloc_size;
      uVar32 = sVar40 + 1;
      if (uVar56 < uVar32) {
        if (uVar56 == 0) {
          uVar56 = uVar32;
        }
        do {
          uVar48 = uVar56;
          uVar56 = uVar48 * 2;
        } while (uVar48 < uVar32);
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar48);
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar18,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar18;
        literal_split->types_alloc_size = uVar48;
        sVar40 = literal_split->num_blocks;
        uVar32 = sVar40 + 1;
      }
      uVar56 = literal_split->lengths_alloc_size;
      if (uVar56 < uVar32) {
        if (uVar56 == 0) {
          uVar56 = uVar32;
        }
        do {
          uVar48 = uVar56;
          uVar56 = uVar48 * 2;
        } while (uVar48 < uVar32);
        puVar19 = (uint32_t *)BrotliAllocate(m,uVar48 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar19,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar19;
        literal_split->lengths_alloc_size = uVar48;
        sVar40 = literal_split->num_blocks;
      }
      literal_split->num_types = 1;
      literal_split->types[sVar40] = '\0';
      sVar40 = literal_split->num_blocks;
      literal_split->lengths[sVar40] = (uint)sVar47;
      literal_split->num_blocks = sVar40 + 1;
    }
    else {
      pvVar22 = BrotliAllocate(m,uVar56 * 0x410);
      lVar53 = 0;
      do {
        memset((void *)(lVar53 + (long)pvVar22),0,0x408);
        *(undefined8 *)((long)pvVar22 + lVar53 + 0x408) = 0x7ff0000000000000;
        lVar53 = lVar53 + 0x410;
      } while (uVar56 * 0x410 - lVar53 != 0);
      uVar48 = 0;
      iVar122 = 7;
      do {
        uVar25 = (uVar48 * sVar47) / uVar56;
        if (uVar48 != 0) {
          uVar55 = (ulong)(uint)(iVar122 * 0x41a7);
          if (iVar122 == 0) {
            uVar55 = 1;
          }
          uVar25 = uVar25 + uVar55 % (sVar47 / uVar56);
          iVar122 = (int)uVar55;
        }
        if (sVar47 <= uVar25 + 0x46) {
          uVar25 = sVar47 - 0x47;
        }
        plVar2 = (long *)((long)pvVar22 + uVar48 * 0x410 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar53 = -0x46;
        do {
          piVar1 = (int *)((long)pvVar22 +
                          (ulong)*(byte *)((long)local_fe0 + lVar53 + uVar25 + 0x46) * 4 +
                          uVar48 * 0x410);
          *piVar1 = *piVar1 + 1;
          lVar53 = lVar53 + 1;
        } while (lVar53 != 0);
        uVar48 = uVar48 + 1;
      } while (uVar48 != uVar56);
      uVar48 = (sVar47 * 2) / 0x46 + uVar56 + 99;
      if (uVar48 != uVar48 % uVar56) {
        uVar55 = 7;
        uVar25 = 0;
        do {
          memset(local_b40,0,0x408);
          uVar51 = (int)uVar55 * 0x41a7;
          if ((int)uVar55 == 0) {
            uVar51 = 1;
          }
          uVar55 = (ulong)uVar51;
          pbVar38 = (byte *)(uVar55 % (sVar47 - 0x45) + (long)local_fe0);
          lVar53 = -0x46;
          do {
            bVar44 = *pbVar38;
            pbVar38 = pbVar38 + 1;
            *(int *)(local_b40 + (ulong)bVar44 * 4) = *(int *)(local_b40 + (ulong)bVar44 * 4) + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0);
          lVar53 = (uVar25 % uVar56) * 0x410;
          plVar2 = (long *)((long)pvVar22 + lVar53 + 0x400);
          *plVar2 = *plVar2 + 0x46;
          lVar36 = 0;
          do {
            lVar31 = lVar36 * 4;
            piVar1 = (int *)((long)pvVar22 + lVar36 * 4 + lVar53);
            auVar66._0_4_ = *piVar1 + *(int *)(local_b40 + lVar31);
            auVar66._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar31 + 4);
            auVar66._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar31 + 8);
            auVar66._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar31 + 0xc);
            *(undefined1 (*) [16])((long)pvVar22 + lVar36 * 4 + lVar53) = auVar66;
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0x100);
          uVar25 = uVar25 + 1;
        } while (uVar25 < uVar48 - uVar48 % uVar56);
      }
      pvVar27 = BrotliAllocate(m,sVar47);
      iVar122 = (int)uVar56;
      pvVar28 = BrotliAllocate(m,(ulong)(uint)(iVar122 << 0xb));
      pvVar29 = BrotliAllocate(m,(ulong)(uint)(iVar122 * 8));
      sVar40 = (iVar122 + 7U >> 3) * sVar47;
      if (sVar40 == 0) {
        local_f78 = (void *)0x0;
      }
      else {
        local_f78 = BrotliAllocate(m,sVar40);
      }
      pvVar30 = BrotliAllocate(m,(ulong)(uint)(iVar122 * 2));
      lVar53 = 3;
      if (10 < params->quality) {
        lVar53 = 10;
      }
      lVar36 = sVar42 + uVar32;
      lVar31 = 0;
      do {
        uVar48 = uVar56 + 7 >> 3;
        if (uVar56 < 2) {
          memset(pvVar27,0,sVar47);
          uVar25 = 1;
          auVar66 = _DAT_00139180;
        }
        else {
          memset(pvVar28,0,uVar56 << 0xb);
          uVar25 = 0;
          puVar39 = (uint *)((long)pvVar22 + 0x400);
          do {
            uVar55 = (ulong)*puVar39;
            if (uVar55 < 0x100) {
              dVar58 = (double)kLog2Table[uVar55];
            }
            else {
              dVar58 = log2((double)uVar55);
            }
            *(double *)((long)pvVar28 + uVar25 * 8) = dVar58;
            uVar25 = uVar25 + 1;
            puVar39 = puVar39 + 0x104;
          } while (uVar56 != uVar25);
          pvVar50 = (void *)(uVar56 * 0x7f8 + (long)pvVar28);
          lVar20 = 0x100;
          puVar39 = (uint *)((long)pvVar22 + 0x3fc);
          do {
            lVar20 = lVar20 + -1;
            uVar25 = 0;
            puVar41 = puVar39;
            do {
              dVar57 = -2.0;
              dVar58 = *(double *)((long)pvVar28 + uVar25 * 8);
              uVar55 = (ulong)*puVar41;
              if (uVar55 != 0) {
                if (*puVar41 < 0x100) {
                  dVar57 = (double)kLog2Table[uVar55];
                }
                else {
                  dVar57 = log2((double)uVar55);
                }
              }
              *(double *)((long)pvVar50 + uVar25 * 8) = dVar58 - dVar57;
              uVar25 = uVar25 + 1;
              puVar41 = puVar41 + 0x104;
            } while (uVar56 != uVar25);
            pvVar50 = (void *)((long)pvVar50 + uVar56 * -8);
            puVar39 = puVar39 + -1;
          } while (lVar20 != 0);
          memset(pvVar29,0,uVar56 * 8);
          memset(local_f78,0,uVar48 * sVar47);
          auVar66 = _DAT_00139180;
          uVar25 = 0;
          do {
            bVar44 = *(byte *)((long)local_fe0 + uVar25);
            uVar55 = 0;
            dVar58 = 1e+99;
            do {
              dVar57 = *(double *)((long)pvVar28 + uVar55 * 8 + bVar44 * uVar56 * 8) +
                       *(double *)((long)pvVar29 + uVar55 * 8);
              *(double *)((long)pvVar29 + uVar55 * 8) = dVar57;
              if (dVar57 < dVar58) {
                *(char *)((long)pvVar27 + uVar25) = (char)uVar55;
                dVar58 = dVar57;
              }
              uVar55 = uVar55 + 1;
            } while (uVar56 != uVar55);
            dVar57 = 28.1;
            if (uVar25 < 2000) {
              dVar57 = (((double)(long)uVar25 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            uVar55 = 0;
            do {
              dVar74 = *(double *)((long)pvVar29 + uVar55 * 8) - dVar58;
              *(double *)((long)pvVar29 + uVar55 * 8) = dVar74;
              if (dVar57 <= dVar74) {
                *(double *)((long)pvVar29 + uVar55 * 8) = dVar57;
                if (uVar48 <= uVar55 >> 3) {
                  pcVar37 = 
                  "size_t FindBlocksLiteral(const uint8_t *, const size_t, const double, const size_t, const HistogramLiteral *, double *, double *, uint8_t *, uint8_t *)"
                  ;
                  goto LAB_001160d6;
                }
                pbVar38 = (byte *)((long)local_f78 + (uVar55 >> 3) + uVar25 * uVar48);
                *pbVar38 = *pbVar38 | '\x01' << ((byte)uVar55 & 7);
              }
              uVar55 = uVar55 + 1;
            } while (uVar56 != uVar55);
            uVar25 = uVar25 + 1;
          } while (uVar25 != sVar47);
          bVar44 = *(byte *)((long)pvVar27 + (sVar47 - 1));
          pvVar50 = (void *)((sVar42 + uVar32 + -2) * uVar48 + (long)local_f78);
          uVar25 = 1;
          lVar20 = lVar36;
          do {
            if (uVar48 <= bVar44 >> 3) {
              pcVar37 = 
              "size_t FindBlocksLiteral(const uint8_t *, const size_t, const double, const size_t, const HistogramLiteral *, double *, double *, uint8_t *, uint8_t *)"
              ;
              goto LAB_001161bd;
            }
            if ((*(byte *)((long)pvVar50 + (ulong)(bVar44 >> 3)) >> (bVar44 & 7) & 1) != 0) {
              bVar46 = *(byte *)((long)pvVar27 + lVar20 + -2);
              uVar25 = uVar25 + (bVar44 != bVar46);
              bVar44 = bVar46;
            }
            *(byte *)((long)pvVar27 + lVar20 + -2) = bVar44;
            pvVar50 = (void *)((long)pvVar50 - uVar48);
            lVar20 = lVar20 + -1;
          } while (lVar20 != 1);
        }
        if (uVar56 != 0) {
          lVar20 = uVar56 - 1;
          auVar102._8_4_ = (int)lVar20;
          auVar102._0_8_ = lVar20;
          auVar102._12_4_ = (int)((ulong)lVar20 >> 0x20);
          auVar102 = auVar102 ^ auVar66;
          lVar20 = 0;
          auVar97 = _DAT_00139170;
          auVar135 = _DAT_00139160;
          auVar139 = _DAT_00139f40;
          auVar101 = _DAT_00139f30;
          do {
            auVar118 = auVar97 ^ auVar66;
            iVar122 = auVar102._0_4_;
            iVar121 = -(uint)(iVar122 < auVar118._0_4_);
            iVar64 = auVar102._4_4_;
            auVar81._4_4_ = -(uint)(iVar64 < auVar118._4_4_);
            iVar130 = auVar102._8_4_;
            iVar129 = -(uint)(iVar130 < auVar118._8_4_);
            iVar65 = auVar102._12_4_;
            auVar81._12_4_ = -(uint)(iVar65 < auVar118._12_4_);
            auVar109._4_4_ = iVar121;
            auVar109._0_4_ = iVar121;
            auVar109._8_4_ = iVar129;
            auVar109._12_4_ = iVar129;
            auVar131 = pshuflw(in_XMM8,auVar109,0xe8);
            auVar83._4_4_ = -(uint)(auVar118._4_4_ == iVar64);
            auVar83._12_4_ = -(uint)(auVar118._12_4_ == iVar65);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar138 = pshuflw(in_XMM9,auVar83,0xe8);
            auVar81._0_4_ = auVar81._4_4_;
            auVar81._8_4_ = auVar81._12_4_;
            auVar132 = pshuflw(auVar131,auVar81,0xe8);
            auVar118._8_4_ = 0xffffffff;
            auVar118._0_8_ = 0xffffffffffffffff;
            auVar118._12_4_ = 0xffffffff;
            auVar118 = (auVar132 | auVar138 & auVar131) ^ auVar118;
            auVar118 = packssdw(auVar118,auVar118);
            if ((auVar118 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20) = 0x100;
            }
            auVar81 = auVar83 & auVar109 | auVar81;
            auVar118 = packssdw(auVar81,auVar81);
            auVar132._8_4_ = 0xffffffff;
            auVar132._0_8_ = 0xffffffffffffffff;
            auVar132._12_4_ = 0xffffffff;
            auVar118 = packssdw(auVar118 ^ auVar132,auVar118 ^ auVar132);
            if ((auVar118._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 2) = 0x100;
            }
            auVar118 = auVar135 ^ auVar66;
            iVar121 = -(uint)(iVar122 < auVar118._0_4_);
            auVar123._4_4_ = -(uint)(iVar64 < auVar118._4_4_);
            iVar129 = -(uint)(iVar130 < auVar118._8_4_);
            auVar123._12_4_ = -(uint)(iVar65 < auVar118._12_4_);
            auVar82._4_4_ = iVar121;
            auVar82._0_4_ = iVar121;
            auVar82._8_4_ = iVar129;
            auVar82._12_4_ = iVar129;
            auVar108._4_4_ = -(uint)(auVar118._4_4_ == iVar64);
            auVar108._12_4_ = -(uint)(auVar118._12_4_ == iVar65);
            auVar108._0_4_ = auVar108._4_4_;
            auVar108._8_4_ = auVar108._12_4_;
            auVar123._0_4_ = auVar123._4_4_;
            auVar123._8_4_ = auVar123._12_4_;
            auVar118 = auVar108 & auVar82 | auVar123;
            auVar118 = packssdw(auVar118,auVar118);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            auVar118 = packssdw(auVar118 ^ auVar14,auVar118 ^ auVar14);
            if ((auVar118 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 4) = 0x100;
            }
            auVar83 = pshufhw(auVar82,auVar82,0x84);
            auVar109 = pshufhw(auVar108,auVar108,0x84);
            auVar81 = pshufhw(auVar83,auVar123,0x84);
            auVar84._8_4_ = 0xffffffff;
            auVar84._0_8_ = 0xffffffffffffffff;
            auVar84._12_4_ = 0xffffffff;
            auVar84 = (auVar81 | auVar109 & auVar83) ^ auVar84;
            auVar83 = packssdw(auVar84,auVar84);
            if ((auVar83 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 6) = 0x100;
            }
            auVar83 = auVar139 ^ auVar66;
            iVar121 = -(uint)(iVar122 < auVar83._0_4_);
            auVar86._4_4_ = -(uint)(iVar64 < auVar83._4_4_);
            iVar129 = -(uint)(iVar130 < auVar83._8_4_);
            auVar86._12_4_ = -(uint)(iVar65 < auVar83._12_4_);
            auVar110._4_4_ = iVar121;
            auVar110._0_4_ = iVar121;
            auVar110._8_4_ = iVar129;
            auVar110._12_4_ = iVar129;
            auVar118 = pshuflw(auVar118,auVar110,0xe8);
            auVar85._4_4_ = -(uint)(auVar83._4_4_ == iVar64);
            auVar85._12_4_ = -(uint)(auVar83._12_4_ == iVar65);
            auVar85._0_4_ = auVar85._4_4_;
            auVar85._8_4_ = auVar85._12_4_;
            in_XMM9 = pshuflw(auVar138 & auVar131,auVar85,0xe8);
            in_XMM9 = in_XMM9 & auVar118;
            auVar86._0_4_ = auVar86._4_4_;
            auVar86._8_4_ = auVar86._12_4_;
            auVar118 = pshuflw(auVar118,auVar86,0xe8);
            auVar131._8_4_ = 0xffffffff;
            auVar131._0_8_ = 0xffffffffffffffff;
            auVar131._12_4_ = 0xffffffff;
            auVar131 = (auVar118 | in_XMM9) ^ auVar131;
            auVar118 = packssdw(auVar131,auVar131);
            if ((auVar118 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 8) = 0x100;
            }
            auVar86 = auVar85 & auVar110 | auVar86;
            auVar118 = packssdw(auVar86,auVar86);
            auVar138._8_4_ = 0xffffffff;
            auVar138._0_8_ = 0xffffffffffffffff;
            auVar138._12_4_ = 0xffffffff;
            auVar118 = packssdw(auVar118 ^ auVar138,auVar118 ^ auVar138);
            if ((auVar118 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 10) = 0x100;
            }
            auVar118 = auVar101 ^ auVar66;
            iVar122 = -(uint)(iVar122 < auVar118._0_4_);
            auVar124._4_4_ = -(uint)(iVar64 < auVar118._4_4_);
            iVar130 = -(uint)(iVar130 < auVar118._8_4_);
            auVar124._12_4_ = -(uint)(iVar65 < auVar118._12_4_);
            auVar87._4_4_ = iVar122;
            auVar87._0_4_ = iVar122;
            auVar87._8_4_ = iVar130;
            auVar87._12_4_ = iVar130;
            auVar111._4_4_ = -(uint)(auVar118._4_4_ == iVar64);
            auVar111._12_4_ = -(uint)(auVar118._12_4_ == iVar65);
            auVar111._0_4_ = auVar111._4_4_;
            auVar111._8_4_ = auVar111._12_4_;
            auVar124._0_4_ = auVar124._4_4_;
            auVar124._8_4_ = auVar124._12_4_;
            auVar118 = auVar111 & auVar87 | auVar124;
            auVar118 = packssdw(auVar118,auVar118);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar118 ^ auVar15,auVar118 ^ auVar15);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 0xc) = 0x100;
            }
            auVar118 = pshufhw(auVar87,auVar87,0x84);
            auVar81 = pshufhw(auVar111,auVar111,0x84);
            auVar83 = pshufhw(auVar118,auVar124,0x84);
            auVar88._8_4_ = 0xffffffff;
            auVar88._0_8_ = 0xffffffffffffffff;
            auVar88._12_4_ = 0xffffffff;
            auVar88 = (auVar83 | auVar81 & auVar118) ^ auVar88;
            auVar118 = packssdw(auVar88,auVar88);
            if ((auVar118 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar30 + lVar20 + 0xe) = 0x100;
            }
            lVar35 = auVar97._8_8_;
            auVar97._0_8_ = auVar97._0_8_ + 8;
            auVar97._8_8_ = lVar35 + 8;
            lVar35 = auVar135._8_8_;
            auVar135._0_8_ = auVar135._0_8_ + 8;
            auVar135._8_8_ = lVar35 + 8;
            lVar35 = auVar139._8_8_;
            auVar139._0_8_ = auVar139._0_8_ + 8;
            auVar139._8_8_ = lVar35 + 8;
            lVar35 = auVar101._8_8_;
            auVar101._0_8_ = auVar101._0_8_ + 8;
            auVar101._8_8_ = lVar35 + 8;
            lVar20 = lVar20 + 0x10;
          } while (uVar48 * 0x10 != lVar20);
        }
        lVar20 = 0;
        uVar16 = 0;
        do {
          uVar48 = (ulong)*(byte *)((long)pvVar27 + lVar20);
          if (uVar56 <= uVar48) {
            pcVar37 = 
            "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00116168;
          }
          if (*(short *)((long)pvVar30 + uVar48 * 2) == 0x100) {
            *(ushort *)((long)pvVar30 + uVar48 * 2) = uVar16;
            uVar16 = uVar16 + 1;
          }
          lVar20 = lVar20 + 1;
        } while (lVar36 != lVar20);
        uVar48 = (ulong)uVar16;
        lVar20 = 0;
        do {
          uVar3 = *(ushort *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + lVar20) * 2);
          *(char *)((long)pvVar27 + lVar20) = (char)uVar3;
          if ((ushort)uVar56 <= (uVar3 & 0xff)) {
            pcVar37 = 
            "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00116187;
          }
          lVar20 = lVar20 + 1;
        } while (lVar36 != lVar20);
        if (uVar56 < uVar48) {
          pcVar37 = "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_0011626f;
        }
        if (uVar16 != 0) {
          lVar20 = 0;
          do {
            memset((void *)((long)pvVar22 + lVar20),0,0x408);
            *(undefined8 *)((long)pvVar22 + lVar20 + 0x408) = 0x7ff0000000000000;
            lVar20 = lVar20 + 0x410;
          } while (uVar48 * 0x410 - lVar20 != 0);
        }
        lVar20 = 0;
        do {
          lVar35 = (ulong)*(byte *)((long)pvVar27 + lVar20) * 0x410;
          piVar1 = (int *)((long)pvVar22 + (ulong)*(byte *)((long)local_fe0 + lVar20) * 4 + lVar35);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar22 + lVar35 + 0x400);
          *plVar2 = *plVar2 + 1;
          lVar20 = lVar20 + 1;
        } while (lVar36 != lVar20);
        lVar31 = lVar31 + 1;
        uVar56 = uVar48;
      } while (lVar31 != lVar53);
      BrotliFree(m,pvVar28);
      BrotliFree(m,pvVar29);
      BrotliFree(m,local_f78);
      BrotliFree(m,pvVar30);
      BrotliFree(m,pvVar22);
      if (uVar25 == 0) {
        local_ff8 = (HistogramCommand *)BrotliAllocate(m,0x3cf0);
        local_f98 = (uint32_t *)BrotliAllocate(m,0x3c);
        local_f88 = 0xf;
        sVar40 = 0;
        pvVar22 = (void *)0x0;
        local_fd0 = (uint32_t *)0x0;
        local_fb8 = (HistogramDistance *)0x0;
      }
      else {
        sVar40 = uVar25 * 4;
        local_fd0 = (uint32_t *)BrotliAllocate(m,sVar40);
        pvVar22 = BrotliAllocate(m,sVar40);
        uVar56 = uVar25 * 0x10 + 0x3f0;
        local_f88 = uVar56 >> 6;
        if (uVar56 < 0x40) {
          local_f98 = (uint32_t *)0x0;
          local_ff8 = (HistogramCommand *)0x0;
        }
        else {
          local_ff8 = (HistogramCommand *)BrotliAllocate(m,local_f88 * 0x410);
          local_f98 = (uint32_t *)BrotliAllocate(m,local_f88 * 4);
        }
        uVar56 = 0x40;
        if (uVar25 < 0x40) {
          uVar56 = uVar25;
        }
        local_fb8 = (HistogramDistance *)BrotliAllocate(m,uVar56 * 0x410);
      }
      local_f80 = (HistogramPair *)BrotliAllocate(m,0xc018);
      uVar56 = 0;
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar22,0,sVar40);
      lVar53 = 0;
      do {
        if (uVar25 <= uVar56) {
          pcVar37 = 
          "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_0011628e;
        }
        piVar1 = (int *)((long)pvVar22 + uVar56 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar42 + uVar32 + -1 == lVar53) ||
           (*(char *)((long)pvVar27 + lVar53) != *(char *)((long)pvVar27 + lVar53 + 1))) {
          uVar56 = uVar56 + 1;
        }
        lVar53 = lVar53 + 1;
      } while (sVar42 + uVar32 != lVar53);
      if (uVar56 != uVar25) {
        pcVar37 = 
        "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
        goto LAB_001162fa;
      }
      local_f90 = (void *)local_f88;
      local_ff0 = 0;
      local_fc8 = 0.0;
      puVar19 = local_fd0;
      uVar32 = uVar25;
      uVar56 = 0;
      do {
        uVar48 = 0x40;
        if (uVar32 < 0x40) {
          uVar48 = uVar32;
        }
        lVar53 = uVar48 + (uVar48 == 0);
        lVar36 = 0;
        do {
          pHVar21 = (HistogramLiteral *)((long)local_fb8 + lVar36 * 0x410);
          memset(pHVar21,0,0x408);
          ((HistogramLiteral *)((long)local_fb8 + lVar36 * 0x410))->bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar22 + (local_ff0 + lVar36) * 4) != 0) {
            uVar48 = 0;
            do {
              pHVar21->data_[*(byte *)((long)local_fe0 + uVar48 + (long)local_fc8)] =
                   pHVar21->data_[*(byte *)((long)local_fe0 + uVar48 + (long)local_fc8)] + 1;
              uVar48 = uVar48 + 1;
              pHVar21->total_count_ = uVar48;
            } while (uVar48 < *(uint *)((long)pvVar22 + (local_ff0 + lVar36) * 4));
            local_fc8 = (double)((long)local_fc8 + uVar48);
          }
          dVar58 = BrotliPopulationCostLiteral(pHVar21);
          pHVar21->bit_cost_ = dVar58;
          new_clusters[lVar36] = (uint32_t)lVar36;
          symbols[lVar36] = (uint32_t)lVar36;
          sizes[lVar36] = 1;
          lVar36 = lVar36 + 1;
        } while (lVar36 != lVar53);
        sVar40 = uVar25 - local_ff0;
        if (0x3f < sVar40) {
          sVar40 = 0x40;
        }
        sVar40 = BrotliHistogramCombineLiteral
                           ((HistogramLiteral *)local_fb8,sizes,symbols,new_clusters,local_f80,
                            sVar40,sVar40,0x40,0x800);
        uVar48 = sVar40 + uVar56;
        uVar55 = local_f88;
        if (local_f88 < uVar48) {
          uVar52 = local_f88;
          if (local_f88 == 0) {
            uVar52 = uVar48;
          }
          do {
            uVar55 = uVar52;
            uVar52 = uVar55 * 2;
          } while (uVar55 < uVar48);
          pHVar21 = (HistogramLiteral *)BrotliAllocate(m,uVar55 * 0x410);
          if (local_f88 != 0) {
            memcpy(pHVar21,local_ff8,local_f88 * 0x410);
          }
          BrotliFree(m,local_ff8);
          local_ff8 = (HistogramCommand *)pHVar21;
        }
        if (local_f90 < uVar48) {
          pvVar28 = local_f90;
          if (local_f90 == (void *)0x0) {
            pvVar28 = (void *)uVar48;
          }
          do {
            uVar52 = (ulong)pvVar28;
            pvVar28 = (void *)(uVar52 * 2);
          } while (uVar52 < uVar48);
          puVar34 = (uint32_t *)BrotliAllocate(m,uVar52 * 4);
          if (local_f90 != (void *)0x0) {
            memcpy(puVar34,local_f98,(long)local_f90 << 2);
          }
          BrotliFree(m,local_f98);
          local_f98 = puVar34;
          local_f90 = (void *)uVar52;
        }
        uVar52 = uVar56;
        if (sVar40 != 0) {
          pHVar21 = (HistogramLiteral *)((long)local_ff8 + uVar56 * 0x410);
          sVar47 = 0;
          do {
            uVar51 = new_clusters[sVar47];
            memcpy(pHVar21,(HistogramLiteral *)((long)local_fb8 + (ulong)uVar51 * 0x410),0x410);
            local_f98[uVar56 + sVar47] = sizes[uVar51];
            remap[new_clusters[sVar47]] = (uint32_t)sVar47;
            sVar47 = sVar47 + 1;
            pHVar21 = pHVar21 + 1;
          } while (sVar40 != sVar47);
          uVar52 = sVar47 + uVar56;
        }
        lVar36 = 0;
        do {
          puVar19[lVar36] = remap[symbols[lVar36]] + (int)uVar56;
          lVar36 = lVar36 + 1;
        } while (lVar53 != lVar36);
        if (uVar48 != uVar52) {
          pcVar37 = 
          "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_001162ad;
        }
        local_ff0 = local_ff0 + 0x40;
        uVar32 = uVar32 - 0x40;
        puVar19 = puVar19 + 0x40;
        uVar56 = uVar48;
        local_f88 = uVar55;
      } while (local_ff0 < uVar25);
      BrotliFree(m,local_fb8);
      uVar32 = (uVar48 >> 1) * uVar48;
      if (uVar48 * 0x40 < uVar32) {
        uVar32 = uVar48 * 0x40;
      }
      if (0x800 < uVar32) {
        BrotliFree(m,local_f80);
        local_f80 = (HistogramPair *)BrotliAllocate(m,uVar32 * 0x18 + 0x18);
      }
      if (uVar48 == 0) {
        puVar19 = (uint32_t *)0x0;
      }
      else {
        puVar19 = (uint32_t *)BrotliAllocate(m,uVar48 * 4);
        auVar97 = _DAT_00139f60;
        auVar66 = _DAT_00139180;
        lVar53 = uVar48 - 1;
        auVar59._8_4_ = (int)lVar53;
        auVar59._0_8_ = lVar53;
        auVar59._12_4_ = (int)((ulong)lVar53 >> 0x20);
        uVar56 = 0;
        auVar59 = auVar59 ^ _DAT_00139180;
        auVar67 = _DAT_00139170;
        do {
          bVar5 = auVar59._0_4_ < SUB164(auVar67 ^ auVar66,0);
          iVar122 = auVar59._4_4_;
          iVar64 = SUB164(auVar67 ^ auVar66,4);
          if ((bool)(~(iVar122 < iVar64 || iVar64 == iVar122 && bVar5) & 1)) {
            puVar19[uVar56] = (uint32_t)uVar56;
          }
          if (iVar122 >= iVar64 && (iVar64 != iVar122 || !bVar5)) {
            puVar19[uVar56 + 1] = (uint32_t)uVar56 + 1;
          }
          uVar56 = uVar56 + 2;
          lVar53 = auVar67._8_8_;
          auVar67._0_8_ = auVar67._0_8_ + auVar97._0_8_;
          auVar67._8_8_ = lVar53 + auVar97._8_8_;
        } while ((uVar48 + 1 & 0xfffffffffffffffe) != uVar56);
      }
      sVar40 = BrotliHistogramCombineLiteral
                         ((HistogramLiteral *)local_ff8,local_f98,local_fd0,puVar19,local_f80,uVar48
                          ,uVar25,0x100,uVar32);
      BrotliFree(m,local_f80);
      BrotliFree(m,local_f98);
      iVar122 = 0;
      if (uVar48 == 0) {
        local_fd8 = (void *)0x0;
      }
      else {
        local_fd8 = BrotliAllocate(m,uVar48 * 4);
        memset(local_fd8,0xff,uVar48 * 4);
      }
      uVar32 = 0;
      local_ff0 = 0;
      do {
        memset(local_b40,0,0x408);
        local_b40._1032_8_ = INFINITY;
        if (*(int *)((long)pvVar22 + uVar32 * 4) != 0) {
          uVar56 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(byte *)((long)local_fe0 + uVar56 + local_ff0) * 4) =
                 *(int *)(local_b40 + (ulong)*(byte *)((long)local_fe0 + uVar56 + local_ff0) * 4) +
                 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 < *(uint *)((long)pvVar22 + uVar32 * 4));
          local_ff0 = local_ff0 + uVar56;
          local_b40._1024_8_ = uVar56;
        }
        lVar53 = 0;
        if (uVar32 != 0) {
          lVar53 = uVar32 - 1;
        }
        uVar51 = local_fd0[lVar53];
        uVar56 = (ulong)uVar51;
        local_fc8 = BrotliHistogramBitCostDistanceLiteral
                              ((HistogramLiteral *)local_b40,
                               (HistogramLiteral *)((long)local_ff8 + uVar56 * 0x410));
        if (sVar40 != 0) {
          sVar47 = 0;
          do {
            dVar58 = BrotliHistogramBitCostDistanceLiteral
                               ((HistogramLiteral *)local_b40,
                                (HistogramLiteral *)
                                ((long)local_ff8 + (ulong)puVar19[sVar47] * 0x410));
            if (dVar58 < local_fc8) {
              uVar56 = (ulong)puVar19[sVar47];
              local_fc8 = dVar58;
            }
            uVar51 = (uint)uVar56;
            sVar47 = sVar47 + 1;
          } while (sVar40 != sVar47);
        }
        local_fd0[uVar32] = uVar51;
        if (*(int *)((long)local_fd8 + uVar56 * 4) == -1) {
          *(int *)((long)local_fd8 + uVar56 * 4) = iVar122;
          iVar122 = iVar122 + 1;
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar25);
      BrotliFree(m,puVar19);
      BrotliFree(m,local_ff8);
      uVar32 = literal_split->types_alloc_size;
      if (uVar32 < uVar25) {
        if (uVar32 == 0) {
          uVar32 = uVar25;
        }
        do {
          uVar56 = uVar32;
          uVar32 = uVar56 * 2;
        } while (uVar56 < uVar25);
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar56);
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar18,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar18;
        literal_split->types_alloc_size = uVar56;
      }
      uVar32 = literal_split->lengths_alloc_size;
      if (uVar32 < uVar25) {
        if (uVar32 == 0) {
          uVar32 = uVar25;
        }
        do {
          uVar56 = uVar32;
          uVar32 = uVar56 * 2;
        } while (uVar56 < uVar25);
        puVar19 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar19,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar19;
        literal_split->lengths_alloc_size = uVar56;
      }
      sVar40 = 0;
      uVar49 = 0;
      uVar32 = 0;
      uVar51 = 0;
      do {
        uVar49 = uVar49 + *(int *)((long)pvVar22 + uVar32 * 4);
        if ((uVar25 - 1 == uVar32) || (local_fd0[uVar32] != local_fd0[uVar32 + 1])) {
          uVar45 = uVar51 & 0xff;
          uVar4 = *(uint *)((long)local_fd8 + (ulong)local_fd0[uVar32] * 4);
          bVar46 = (byte)uVar4;
          literal_split->types[sVar40] = bVar46;
          bVar44 = (byte)uVar51;
          uVar51 = uVar4;
          if (bVar46 < bVar44) {
            uVar51 = uVar45;
          }
          literal_split->lengths[sVar40] = uVar49;
          sVar40 = sVar40 + 1;
          uVar49 = 0;
        }
        uVar32 = uVar32 + 1;
      } while (uVar25 != uVar32);
      literal_split->num_blocks = sVar40;
      literal_split->num_types = (ulong)(uVar51 & 0xff) + 1;
      BrotliFree(m,local_fd8);
      BrotliFree(m,pvVar22);
      BrotliFree(m,local_fd0);
      BrotliFree(m,pvVar27);
    }
  }
  BrotliFree(m,local_fe0);
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
    local_fe8 = (void *)0x0;
    BrotliFree(m,(void *)0x0);
  }
  else {
    sVar40 = num_commands * 2;
    pvVar22 = BrotliAllocate(m,sVar40);
    puVar23 = &cmds->cmd_prefix_;
    sVar47 = 0;
    do {
      *(uint16_t *)((long)pvVar22 + sVar47 * 2) = *puVar23;
      sVar47 = sVar47 + 1;
      puVar23 = puVar23 + 8;
    } while (num_commands != sVar47);
    uVar32 = 0x32;
    if (num_commands < 0x6784) {
      uVar32 = (ulong)(((uint)num_commands & 0xffff) / 0x212 + 1);
    }
    if (num_commands < 0x80) {
      sVar47 = insert_and_copy_split->num_blocks;
      uVar56 = insert_and_copy_split->types_alloc_size;
      uVar32 = sVar47 + 1;
      if (uVar56 < uVar32) {
        if (uVar56 == 0) {
          uVar56 = uVar32;
        }
        do {
          uVar48 = uVar56;
          uVar56 = uVar48 * 2;
        } while (uVar48 < uVar32);
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar48);
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar18,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar18;
        insert_and_copy_split->types_alloc_size = uVar48;
        sVar47 = insert_and_copy_split->num_blocks;
        uVar32 = sVar47 + 1;
      }
      uVar56 = insert_and_copy_split->lengths_alloc_size;
      if (uVar56 < uVar32) {
        if (uVar56 == 0) {
          uVar56 = uVar32;
        }
        do {
          uVar48 = uVar56;
          uVar56 = uVar48 * 2;
        } while (uVar48 < uVar32);
        puVar19 = (uint32_t *)BrotliAllocate(m,uVar48 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar19,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar19;
        insert_and_copy_split->lengths_alloc_size = uVar48;
        sVar47 = insert_and_copy_split->num_blocks;
      }
      insert_and_copy_split->num_types = 1;
      insert_and_copy_split->types[sVar47] = '\0';
      sVar47 = insert_and_copy_split->num_blocks;
      insert_and_copy_split->lengths[sVar47] = (uint)num_commands;
      insert_and_copy_split->num_blocks = sVar47 + 1;
    }
    else {
      pvVar27 = BrotliAllocate(m,uVar32 * 0xb10);
      lVar53 = 0;
      do {
        memset((void *)((long)pvVar27 + lVar53),0,0xb08);
        *(undefined8 *)((long)pvVar27 + lVar53 + 0xb08) = 0x7ff0000000000000;
        lVar53 = lVar53 + 0xb10;
      } while (uVar32 * 0xb10 - lVar53 != 0);
      uVar56 = 0;
      iVar122 = 7;
      do {
        uVar48 = (uVar56 * num_commands) / uVar32;
        if (uVar56 != 0) {
          uVar25 = (ulong)(uint)(iVar122 * 0x41a7);
          if (iVar122 == 0) {
            uVar25 = 1;
          }
          uVar48 = uVar48 + uVar25 % (num_commands / uVar32);
          iVar122 = (int)uVar25;
        }
        if (num_commands <= uVar48 + 0x28) {
          uVar48 = num_commands - 0x29;
        }
        plVar2 = (long *)((long)pvVar27 + uVar56 * 0xb10 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar53 = 0;
        do {
          piVar1 = (int *)((long)pvVar27 +
                          (ulong)*(ushort *)((long)pvVar22 + lVar53 * 2 + uVar48 * 2) * 4 +
                          uVar56 * 0xb10);
          *piVar1 = *piVar1 + 1;
          lVar53 = lVar53 + 1;
        } while (lVar53 != 0x28);
        uVar56 = uVar56 + 1;
      } while (uVar56 != uVar32);
      uVar56 = sVar40 / 0x28 + uVar32 + 99;
      if (uVar56 != uVar56 % uVar32) {
        uVar25 = 7;
        uVar48 = 0;
        do {
          memset(local_b40,0,0xb08);
          uVar51 = (int)uVar25 * 0x41a7;
          if ((int)uVar25 == 0) {
            uVar51 = 1;
          }
          uVar25 = (ulong)uVar51;
          puVar26 = (ushort *)((long)pvVar22 + (uVar25 % (num_commands - 0x27)) * 2);
          lVar53 = -0x28;
          do {
            uVar16 = *puVar26;
            puVar26 = puVar26 + 1;
            *(int *)(local_b40 + (ulong)uVar16 * 4) = *(int *)(local_b40 + (ulong)uVar16 * 4) + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0);
          lVar53 = (uVar48 % uVar32) * 0xb10;
          plVar2 = (long *)((long)pvVar27 + lVar53 + 0xb00);
          *plVar2 = *plVar2 + 0x28;
          lVar36 = 0;
          do {
            lVar31 = lVar36 * 4;
            piVar1 = (int *)((long)pvVar27 + lVar36 * 4 + lVar53);
            auVar68._0_4_ = *piVar1 + *(int *)(local_b40 + lVar31);
            auVar68._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar31 + 4);
            auVar68._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar31 + 8);
            auVar68._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar31 + 0xc);
            *(undefined1 (*) [16])((long)pvVar27 + lVar36 * 4 + lVar53) = auVar68;
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0x2c0);
          uVar48 = uVar48 + 1;
        } while (uVar48 < uVar56 - uVar56 % uVar32);
      }
      pvVar28 = BrotliAllocate(m,num_commands);
      iVar122 = (int)uVar32;
      pvVar29 = BrotliAllocate(m,uVar32 * 0x1600);
      pvVar30 = BrotliAllocate(m,(ulong)(uint)(iVar122 * 8));
      sVar47 = (iVar122 + 7U >> 3) * num_commands;
      if (sVar47 == 0) {
        local_fa8 = (uint32_t *)0x0;
      }
      else {
        local_fa8 = (uint32_t *)BrotliAllocate(m,sVar47);
      }
      pvVar50 = BrotliAllocate(m,(ulong)(uint)(iVar122 * 2));
      lVar53 = 3;
      if (10 < params->quality) {
        lVar53 = 10;
      }
      lVar36 = 0;
      do {
        uVar56 = uVar32 + 7 >> 3;
        if (uVar32 < 2) {
          memset(pvVar28,0,num_commands);
          uVar48 = 1;
          auVar66 = _DAT_00139180;
        }
        else {
          memset(pvVar29,0,uVar32 * 0x1600);
          uVar48 = 0;
          puVar39 = (uint *)((long)pvVar27 + 0xb00);
          do {
            uVar25 = (ulong)*puVar39;
            if (uVar25 < 0x100) {
              dVar58 = (double)kLog2Table[uVar25];
            }
            else {
              dVar58 = log2((double)uVar25);
            }
            *(double *)((long)pvVar29 + uVar48 * 8) = dVar58;
            uVar48 = uVar48 + 1;
            puVar39 = puVar39 + 0x2c4;
          } while (uVar32 != uVar48);
          pvVar54 = (void *)(uVar32 * 0x15f8 + (long)pvVar29);
          lVar31 = 0x2c0;
          puVar39 = (uint *)((long)pvVar27 + 0xafc);
          do {
            lVar31 = lVar31 + -1;
            uVar48 = 0;
            puVar41 = puVar39;
            do {
              dVar57 = -2.0;
              dVar58 = *(double *)((long)pvVar29 + uVar48 * 8);
              uVar25 = (ulong)*puVar41;
              if (uVar25 != 0) {
                if (*puVar41 < 0x100) {
                  dVar57 = (double)kLog2Table[uVar25];
                }
                else {
                  dVar57 = log2((double)uVar25);
                }
              }
              *(double *)((long)pvVar54 + uVar48 * 8) = dVar58 - dVar57;
              uVar48 = uVar48 + 1;
              puVar41 = puVar41 + 0x2c4;
            } while (uVar32 != uVar48);
            pvVar54 = (void *)((long)pvVar54 + uVar32 * -8);
            puVar39 = puVar39 + -1;
          } while (lVar31 != 0);
          memset(pvVar30,0,uVar32 * 8);
          memset(local_fa8,0,uVar56 * num_commands);
          auVar66 = _DAT_00139180;
          uVar48 = 0;
          do {
            uVar16 = *(ushort *)((long)pvVar22 + uVar48 * 2);
            uVar25 = 0;
            dVar58 = 1e+99;
            do {
              dVar57 = *(double *)((long)pvVar29 + uVar25 * 8 + uVar16 * uVar32 * 8) +
                       *(double *)((long)pvVar30 + uVar25 * 8);
              *(double *)((long)pvVar30 + uVar25 * 8) = dVar57;
              if (dVar57 < dVar58) {
                *(char *)((long)pvVar28 + uVar48) = (char)uVar25;
                dVar58 = dVar57;
              }
              uVar25 = uVar25 + 1;
            } while (uVar32 != uVar25);
            dVar57 = 13.5;
            if (uVar48 < 2000) {
              dVar57 = (((double)(long)uVar48 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            uVar25 = 0;
            do {
              dVar74 = *(double *)((long)pvVar30 + uVar25 * 8) - dVar58;
              *(double *)((long)pvVar30 + uVar25 * 8) = dVar74;
              if (dVar57 <= dVar74) {
                *(double *)((long)pvVar30 + uVar25 * 8) = dVar57;
                if (uVar56 <= uVar25 >> 3) {
                  pcVar37 = 
                  "size_t FindBlocksCommand(const uint16_t *, const size_t, const double, const size_t, const HistogramCommand *, double *, double *, uint8_t *, uint8_t *)"
                  ;
                  goto LAB_001160d6;
                }
                pbVar38 = (byte *)((long)local_fa8 + (uVar25 >> 3) + uVar48 * uVar56);
                *pbVar38 = *pbVar38 | '\x01' << ((byte)uVar25 & 7);
              }
              uVar25 = uVar25 + 1;
            } while (uVar32 != uVar25);
            uVar48 = uVar48 + 1;
          } while (uVar48 != num_commands);
          bVar44 = *(byte *)((long)pvVar28 + (num_commands - 1));
          pvVar54 = (void *)((num_commands - 2) * uVar56 + (long)local_fa8);
          uVar48 = 1;
          sVar47 = num_commands;
          do {
            if (uVar56 <= bVar44 >> 3) {
              pcVar37 = 
              "size_t FindBlocksCommand(const uint16_t *, const size_t, const double, const size_t, const HistogramCommand *, double *, double *, uint8_t *, uint8_t *)"
              ;
              goto LAB_001161bd;
            }
            if ((*(byte *)((long)pvVar54 + (ulong)(bVar44 >> 3)) >> (bVar44 & 7) & 1) != 0) {
              bVar46 = *(byte *)((long)pvVar28 + (sVar47 - 2));
              uVar48 = uVar48 + (bVar44 != bVar46);
              bVar44 = bVar46;
            }
            *(byte *)((long)pvVar28 + (sVar47 - 2)) = bVar44;
            pvVar54 = (void *)((long)pvVar54 - uVar56);
            sVar47 = sVar47 - 1;
          } while (sVar47 != 1);
        }
        if (uVar32 != 0) {
          lVar31 = uVar32 - 1;
          auVar60._8_4_ = (int)lVar31;
          auVar60._0_8_ = lVar31;
          auVar60._12_4_ = (int)((ulong)lVar31 >> 0x20);
          auVar60 = auVar60 ^ auVar66;
          lVar31 = 0;
          auVar69 = _DAT_00139170;
          auVar75 = _DAT_00139160;
          auVar77 = _DAT_00139f40;
          auVar79 = _DAT_00139f30;
          do {
            auVar97 = auVar69 ^ auVar66;
            iVar122 = auVar60._0_4_;
            iVar121 = -(uint)(iVar122 < auVar97._0_4_);
            iVar64 = auVar60._4_4_;
            auVar90._4_4_ = -(uint)(iVar64 < auVar97._4_4_);
            iVar130 = auVar60._8_4_;
            iVar129 = -(uint)(iVar130 < auVar97._8_4_);
            iVar65 = auVar60._12_4_;
            auVar90._12_4_ = -(uint)(iVar65 < auVar97._12_4_);
            auVar112._4_4_ = iVar121;
            auVar112._0_4_ = iVar121;
            auVar112._8_4_ = iVar129;
            auVar112._12_4_ = iVar129;
            auVar135 = pshuflw(in_XMM8,auVar112,0xe8);
            auVar89._4_4_ = -(uint)(auVar97._4_4_ == iVar64);
            auVar89._12_4_ = -(uint)(auVar97._12_4_ == iVar65);
            auVar89._0_4_ = auVar89._4_4_;
            auVar89._8_4_ = auVar89._12_4_;
            auVar139 = pshuflw(in_XMM9,auVar89,0xe8);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar97 = pshuflw(auVar135,auVar90,0xe8);
            auVar133._8_4_ = 0xffffffff;
            auVar133._0_8_ = 0xffffffffffffffff;
            auVar133._12_4_ = 0xffffffff;
            auVar133 = (auVar97 | auVar139 & auVar135) ^ auVar133;
            auVar97 = packssdw(auVar133,auVar133);
            if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31) = 0x100;
            }
            auVar90 = auVar89 & auVar112 | auVar90;
            auVar97 = packssdw(auVar90,auVar90);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar97 = packssdw(auVar97 ^ auVar10,auVar97 ^ auVar10);
            if ((auVar97._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 2) = 0x100;
            }
            auVar97 = auVar75 ^ auVar66;
            iVar121 = -(uint)(iVar122 < auVar97._0_4_);
            auVar125._4_4_ = -(uint)(iVar64 < auVar97._4_4_);
            iVar129 = -(uint)(iVar130 < auVar97._8_4_);
            auVar125._12_4_ = -(uint)(iVar65 < auVar97._12_4_);
            auVar91._4_4_ = iVar121;
            auVar91._0_4_ = iVar121;
            auVar91._8_4_ = iVar129;
            auVar91._12_4_ = iVar129;
            auVar113._4_4_ = -(uint)(auVar97._4_4_ == iVar64);
            auVar113._12_4_ = -(uint)(auVar97._12_4_ == iVar65);
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar125._0_4_ = auVar125._4_4_;
            auVar125._8_4_ = auVar125._12_4_;
            auVar97 = auVar113 & auVar91 | auVar125;
            auVar97 = packssdw(auVar97,auVar97);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar97 = packssdw(auVar97 ^ auVar11,auVar97 ^ auVar11);
            if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 4) = 0x100;
            }
            auVar101 = pshufhw(auVar91,auVar91,0x84);
            auVar118 = pshufhw(auVar113,auVar113,0x84);
            auVar102 = pshufhw(auVar101,auVar125,0x84);
            auVar92._8_4_ = 0xffffffff;
            auVar92._0_8_ = 0xffffffffffffffff;
            auVar92._12_4_ = 0xffffffff;
            auVar92 = (auVar102 | auVar118 & auVar101) ^ auVar92;
            auVar101 = packssdw(auVar92,auVar92);
            if ((auVar101 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 6) = 0x100;
            }
            auVar101 = auVar77 ^ auVar66;
            iVar121 = -(uint)(iVar122 < auVar101._0_4_);
            auVar94._4_4_ = -(uint)(iVar64 < auVar101._4_4_);
            iVar129 = -(uint)(iVar130 < auVar101._8_4_);
            auVar94._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
            auVar114._4_4_ = iVar121;
            auVar114._0_4_ = iVar121;
            auVar114._8_4_ = iVar129;
            auVar114._12_4_ = iVar129;
            auVar97 = pshuflw(auVar97,auVar114,0xe8);
            auVar93._4_4_ = -(uint)(auVar101._4_4_ == iVar64);
            auVar93._12_4_ = -(uint)(auVar101._12_4_ == iVar65);
            auVar93._0_4_ = auVar93._4_4_;
            auVar93._8_4_ = auVar93._12_4_;
            in_XMM9 = pshuflw(auVar139 & auVar135,auVar93,0xe8);
            in_XMM9 = in_XMM9 & auVar97;
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar97 = pshuflw(auVar97,auVar94,0xe8);
            auVar134._8_4_ = 0xffffffff;
            auVar134._0_8_ = 0xffffffffffffffff;
            auVar134._12_4_ = 0xffffffff;
            auVar134 = (auVar97 | in_XMM9) ^ auVar134;
            auVar97 = packssdw(auVar134,auVar134);
            if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 8) = 0x100;
            }
            auVar94 = auVar93 & auVar114 | auVar94;
            auVar97 = packssdw(auVar94,auVar94);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar97 = packssdw(auVar97 ^ auVar12,auVar97 ^ auVar12);
            if ((auVar97 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 10) = 0x100;
            }
            auVar97 = auVar79 ^ auVar66;
            iVar122 = -(uint)(iVar122 < auVar97._0_4_);
            auVar126._4_4_ = -(uint)(iVar64 < auVar97._4_4_);
            iVar130 = -(uint)(iVar130 < auVar97._8_4_);
            auVar126._12_4_ = -(uint)(iVar65 < auVar97._12_4_);
            auVar95._4_4_ = iVar122;
            auVar95._0_4_ = iVar122;
            auVar95._8_4_ = iVar130;
            auVar95._12_4_ = iVar130;
            auVar115._4_4_ = -(uint)(auVar97._4_4_ == iVar64);
            auVar115._12_4_ = -(uint)(auVar97._12_4_ == iVar65);
            auVar115._0_4_ = auVar115._4_4_;
            auVar115._8_4_ = auVar115._12_4_;
            auVar126._0_4_ = auVar126._4_4_;
            auVar126._8_4_ = auVar126._12_4_;
            auVar97 = auVar115 & auVar95 | auVar126;
            auVar97 = packssdw(auVar97,auVar97);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar97 ^ auVar13,auVar97 ^ auVar13);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 0xc) = 0x100;
            }
            auVar97 = pshufhw(auVar95,auVar95,0x84);
            auVar139 = pshufhw(auVar115,auVar115,0x84);
            auVar135 = pshufhw(auVar97,auVar126,0x84);
            auVar96._8_4_ = 0xffffffff;
            auVar96._0_8_ = 0xffffffffffffffff;
            auVar96._12_4_ = 0xffffffff;
            auVar96 = (auVar135 | auVar139 & auVar97) ^ auVar96;
            auVar97 = packssdw(auVar96,auVar96);
            if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar50 + lVar31 + 0xe) = 0x100;
            }
            lVar20 = auVar69._8_8_;
            auVar69._0_8_ = auVar69._0_8_ + 8;
            auVar69._8_8_ = lVar20 + 8;
            lVar20 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + 8;
            auVar75._8_8_ = lVar20 + 8;
            lVar20 = auVar77._8_8_;
            auVar77._0_8_ = auVar77._0_8_ + 8;
            auVar77._8_8_ = lVar20 + 8;
            lVar20 = auVar79._8_8_;
            auVar79._0_8_ = auVar79._0_8_ + 8;
            auVar79._8_8_ = lVar20 + 8;
            lVar31 = lVar31 + 0x10;
          } while (uVar56 * 0x10 != lVar31);
        }
        sVar47 = 0;
        uVar16 = 0;
        do {
          uVar56 = (ulong)*(byte *)((long)pvVar28 + sVar47);
          if (uVar32 <= uVar56) {
            pcVar37 = 
            "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00116168;
          }
          if (*(short *)((long)pvVar50 + uVar56 * 2) == 0x100) {
            *(ushort *)((long)pvVar50 + uVar56 * 2) = uVar16;
            uVar16 = uVar16 + 1;
          }
          sVar47 = sVar47 + 1;
        } while (num_commands != sVar47);
        uVar56 = (ulong)uVar16;
        sVar47 = 0;
        do {
          uVar3 = *(ushort *)((long)pvVar50 + (ulong)*(byte *)((long)pvVar28 + sVar47) * 2);
          *(char *)((long)pvVar28 + sVar47) = (char)uVar3;
          if ((ushort)uVar32 <= (uVar3 & 0xff)) {
            pcVar37 = 
            "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00116187;
          }
          sVar47 = sVar47 + 1;
        } while (num_commands != sVar47);
        if (uVar32 < uVar56) {
          pcVar37 = "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_0011626f;
        }
        if (uVar16 != 0) {
          lVar31 = 0;
          do {
            memset((void *)((long)pvVar27 + lVar31),0,0xb08);
            *(undefined8 *)((long)pvVar27 + lVar31 + 0xb08) = 0x7ff0000000000000;
            lVar31 = lVar31 + 0xb10;
          } while (uVar56 * 0xb10 - lVar31 != 0);
        }
        sVar47 = 0;
        do {
          lVar31 = (ulong)*(byte *)((long)pvVar28 + sVar47) * 0xb10;
          piVar1 = (int *)((long)pvVar27 +
                          (ulong)*(ushort *)((long)pvVar22 + sVar47 * 2) * 4 + lVar31);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar27 + lVar31 + 0xb00);
          *plVar2 = *plVar2 + 1;
          sVar47 = sVar47 + 1;
        } while (num_commands != sVar47);
        lVar36 = lVar36 + 1;
        uVar32 = uVar56;
      } while (lVar36 != lVar53);
      BrotliFree(m,pvVar29);
      BrotliFree(m,pvVar30);
      BrotliFree(m,local_fa8);
      BrotliFree(m,pvVar50);
      BrotliFree(m,pvVar27);
      if (uVar48 == 0) {
        local_ff8 = (HistogramCommand *)BrotliAllocate(m,0xa5f0);
        local_fb0 = (uint32_t *)BrotliAllocate(m,0x3c);
        local_f88 = 0xf;
        sVar47 = 0;
        pvVar27 = (void *)0x0;
        local_fd0 = (uint32_t *)0x0;
        pHVar43 = (HistogramCommand *)0x0;
      }
      else {
        sVar47 = uVar48 * 4;
        local_fd0 = (uint32_t *)BrotliAllocate(m,sVar47);
        pvVar27 = BrotliAllocate(m,sVar47);
        uVar32 = uVar48 * 0x10 + 0x3f0;
        local_f88 = uVar32 >> 6;
        if (uVar32 < 0x40) {
          local_fb0 = (uint32_t *)0x0;
          local_ff8 = (HistogramCommand *)0x0;
        }
        else {
          local_ff8 = (HistogramCommand *)BrotliAllocate(m,local_f88 * 0xb10);
          local_fb0 = (uint32_t *)BrotliAllocate(m,local_f88 * 4);
        }
        uVar32 = 0x40;
        if (uVar48 < 0x40) {
          uVar32 = uVar48;
        }
        pHVar43 = (HistogramCommand *)BrotliAllocate(m,uVar32 * 0xb10);
      }
      local_f80 = (HistogramPair *)BrotliAllocate(m,0xc018);
      uVar32 = 0;
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar27,0,sVar47);
      sVar47 = 0;
      do {
        if (uVar48 <= uVar32) {
          pcVar37 = 
          "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_0011628e;
        }
        piVar1 = (int *)((long)pvVar27 + uVar32 * 4);
        *piVar1 = *piVar1 + 1;
        if ((num_commands - 1 == sVar47) ||
           (*(char *)((long)pvVar28 + sVar47) != *(char *)((long)pvVar28 + sVar47 + 1))) {
          uVar32 = uVar32 + 1;
        }
        sVar47 = sVar47 + 1;
      } while (num_commands != sVar47);
      if (uVar32 != uVar48) {
        pcVar37 = 
        "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
        goto LAB_001162fa;
      }
      local_f78 = (void *)local_f88;
      local_ff0 = 0;
      local_fc8 = 0.0;
      puVar19 = local_fd0;
      uVar32 = uVar48;
      uVar56 = 0;
      do {
        uVar25 = 0x40;
        if (uVar32 < 0x40) {
          uVar25 = uVar32;
        }
        lVar53 = uVar25 + (uVar25 == 0);
        lVar36 = 0;
        do {
          pHVar24 = pHVar43 + lVar36;
          memset(pHVar24,0,0xb08);
          pHVar43[lVar36].bit_cost_ = INFINITY;
          if (*(int *)((long)pvVar27 + (local_ff0 + lVar36) * 4) != 0) {
            uVar25 = 0;
            do {
              pHVar24->data_[*(ushort *)((long)pvVar22 + uVar25 * 2 + (long)local_fc8 * 2)] =
                   pHVar24->data_[*(ushort *)((long)pvVar22 + uVar25 * 2 + (long)local_fc8 * 2)] + 1
              ;
              uVar25 = uVar25 + 1;
            } while (uVar25 < *(uint *)((long)pvVar27 + (local_ff0 + lVar36) * 4));
            pHVar24->total_count_ = uVar25;
            local_fc8 = (double)((long)local_fc8 + uVar25);
          }
          dVar58 = BrotliPopulationCostCommand(pHVar24);
          pHVar24->bit_cost_ = dVar58;
          new_clusters[lVar36] = (uint32_t)lVar36;
          symbols[lVar36] = (uint32_t)lVar36;
          sizes[lVar36] = 1;
          lVar36 = lVar36 + 1;
        } while (lVar36 != lVar53);
        sVar47 = uVar48 - local_ff0;
        if (0x3f < sVar47) {
          sVar47 = 0x40;
        }
        sVar47 = BrotliHistogramCombineCommand
                           (pHVar43,sizes,symbols,new_clusters,local_f80,sVar47,sVar47,0x40,0x800);
        uVar25 = sVar47 + uVar56;
        if (local_f88 < uVar25) {
          uVar55 = local_f88;
          if (local_f88 == 0) {
            uVar55 = uVar25;
          }
          do {
            uVar52 = uVar55;
            uVar55 = uVar52 * 2;
          } while (uVar52 < uVar25);
          pHVar24 = (HistogramCommand *)BrotliAllocate(m,uVar52 * 0xb10);
          if (local_f88 != 0) {
            memcpy(pHVar24,local_ff8,local_f88 * 0xb10);
          }
          BrotliFree(m,local_ff8);
          local_f88 = uVar52;
          local_ff8 = pHVar24;
        }
        if (local_f78 < uVar25) {
          pvVar29 = local_f78;
          if (local_f78 == (void *)0x0) {
            pvVar29 = (void *)uVar25;
          }
          do {
            uVar55 = (ulong)pvVar29;
            pvVar29 = (void *)(uVar55 * 2);
          } while (uVar55 < uVar25);
          puVar34 = (uint32_t *)BrotliAllocate(m,uVar55 * 4);
          if (local_f78 != (void *)0x0) {
            memcpy(puVar34,local_fb0,(long)local_f78 << 2);
          }
          BrotliFree(m,local_fb0);
          local_fb0 = puVar34;
          local_f78 = (void *)uVar55;
        }
        uVar55 = uVar56;
        if (sVar47 != 0) {
          pHVar24 = local_ff8 + uVar56;
          sVar42 = 0;
          do {
            uVar51 = new_clusters[sVar42];
            memcpy(pHVar24,pHVar43 + uVar51,0xb10);
            local_fb0[uVar56 + sVar42] = sizes[uVar51];
            remap[new_clusters[sVar42]] = (uint32_t)sVar42;
            sVar42 = sVar42 + 1;
            pHVar24 = pHVar24 + 1;
          } while (sVar47 != sVar42);
          uVar55 = sVar42 + uVar56;
        }
        lVar36 = 0;
        do {
          puVar19[lVar36] = remap[symbols[lVar36]] + (int)uVar56;
          lVar36 = lVar36 + 1;
        } while (lVar53 != lVar36);
        if (uVar25 != uVar55) {
          pcVar37 = 
          "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_001162ad;
        }
        local_ff0 = local_ff0 + 0x40;
        uVar32 = uVar32 - 0x40;
        puVar19 = puVar19 + 0x40;
        uVar56 = uVar25;
      } while (local_ff0 < uVar48);
      BrotliFree(m,pHVar43);
      uVar32 = (uVar25 >> 1) * uVar25;
      if (uVar25 * 0x40 < uVar32) {
        uVar32 = uVar25 * 0x40;
      }
      if (0x800 < uVar32) {
        BrotliFree(m,local_f80);
        local_f80 = (HistogramPair *)BrotliAllocate(m,uVar32 * 0x18 + 0x18);
      }
      if (uVar25 == 0) {
        puVar19 = (uint32_t *)0x0;
      }
      else {
        puVar19 = (uint32_t *)BrotliAllocate(m,uVar25 * 4);
        auVar97 = _DAT_00139f60;
        auVar66 = _DAT_00139180;
        lVar53 = uVar25 - 1;
        auVar61._8_4_ = (int)lVar53;
        auVar61._0_8_ = lVar53;
        auVar61._12_4_ = (int)((ulong)lVar53 >> 0x20);
        uVar56 = 0;
        auVar61 = auVar61 ^ _DAT_00139180;
        auVar70 = _DAT_00139170;
        do {
          bVar5 = auVar61._0_4_ < SUB164(auVar70 ^ auVar66,0);
          iVar122 = auVar61._4_4_;
          iVar64 = SUB164(auVar70 ^ auVar66,4);
          if ((bool)(~(iVar122 < iVar64 || iVar64 == iVar122 && bVar5) & 1)) {
            puVar19[uVar56] = (uint32_t)uVar56;
          }
          if (iVar122 >= iVar64 && (iVar64 != iVar122 || !bVar5)) {
            puVar19[uVar56 + 1] = (uint32_t)uVar56 + 1;
          }
          uVar56 = uVar56 + 2;
          lVar53 = auVar70._8_8_;
          auVar70._0_8_ = auVar70._0_8_ + auVar97._0_8_;
          auVar70._8_8_ = lVar53 + auVar97._8_8_;
        } while ((uVar25 + 1 & 0xfffffffffffffffe) != uVar56);
      }
      sVar47 = BrotliHistogramCombineCommand
                         (local_ff8,local_fb0,local_fd0,puVar19,local_f80,uVar25,uVar48,0x100,uVar32
                         );
      BrotliFree(m,local_f80);
      BrotliFree(m,local_fb0);
      iVar122 = 0;
      if (uVar25 == 0) {
        local_fd8 = (void *)0x0;
      }
      else {
        local_fd8 = BrotliAllocate(m,uVar25 * 4);
        memset(local_fd8,0xff,uVar25 * 4);
      }
      uVar32 = 0;
      local_ff0 = 0;
      do {
        memset(local_b40,0,0xb08);
        local_38 = INFINITY;
        if (*(int *)((long)pvVar27 + uVar32 * 4) != 0) {
          uVar56 = 0;
          do {
            *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar22 + uVar56 * 2 + local_ff0 * 2) * 4)
                 = *(int *)(local_b40 +
                           (ulong)*(ushort *)((long)pvVar22 + uVar56 * 2 + local_ff0 * 2) * 4) + 1;
            uVar56 = uVar56 + 1;
          } while (uVar56 < *(uint *)((long)pvVar27 + uVar32 * 4));
          local_ff0 = local_ff0 + uVar56;
          local_40 = uVar56;
        }
        lVar53 = 0;
        if (uVar32 != 0) {
          lVar53 = uVar32 - 1;
        }
        uVar51 = local_fd0[lVar53];
        uVar56 = (ulong)uVar51;
        local_fc8 = BrotliHistogramBitCostDistanceCommand
                              ((HistogramCommand *)local_b40,local_ff8 + uVar56);
        if (sVar47 != 0) {
          sVar42 = 0;
          do {
            dVar58 = BrotliHistogramBitCostDistanceCommand
                               ((HistogramCommand *)local_b40,local_ff8 + puVar19[sVar42]);
            if (dVar58 < local_fc8) {
              uVar56 = (ulong)puVar19[sVar42];
              local_fc8 = dVar58;
            }
            uVar51 = (uint)uVar56;
            sVar42 = sVar42 + 1;
          } while (sVar47 != sVar42);
        }
        local_fd0[uVar32] = uVar51;
        if (*(int *)((long)local_fd8 + uVar56 * 4) == -1) {
          *(int *)((long)local_fd8 + uVar56 * 4) = iVar122;
          iVar122 = iVar122 + 1;
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar48);
      BrotliFree(m,puVar19);
      BrotliFree(m,local_ff8);
      uVar32 = insert_and_copy_split->types_alloc_size;
      if (uVar32 < uVar48) {
        if (uVar32 == 0) {
          uVar32 = uVar48;
        }
        do {
          uVar56 = uVar32;
          uVar32 = uVar56 * 2;
        } while (uVar56 < uVar48);
        puVar18 = (uint8_t *)BrotliAllocate(m,uVar56);
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar18,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar18;
        insert_and_copy_split->types_alloc_size = uVar56;
      }
      uVar32 = insert_and_copy_split->lengths_alloc_size;
      if (uVar32 < uVar48) {
        if (uVar32 == 0) {
          uVar32 = uVar48;
        }
        do {
          uVar56 = uVar32;
          uVar32 = uVar56 * 2;
        } while (uVar56 < uVar48);
        puVar19 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar19,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar19;
        insert_and_copy_split->lengths_alloc_size = uVar56;
      }
      sVar47 = 0;
      uVar49 = 0;
      uVar32 = 0;
      uVar51 = 0;
      do {
        uVar49 = uVar49 + *(int *)((long)pvVar27 + uVar32 * 4);
        if ((uVar48 - 1 == uVar32) || (local_fd0[uVar32] != local_fd0[uVar32 + 1])) {
          uVar45 = uVar51 & 0xff;
          uVar4 = *(uint *)((long)local_fd8 + (ulong)local_fd0[uVar32] * 4);
          bVar46 = (byte)uVar4;
          insert_and_copy_split->types[sVar47] = bVar46;
          bVar44 = (byte)uVar51;
          uVar51 = uVar4;
          if (bVar46 < bVar44) {
            uVar51 = uVar45;
          }
          insert_and_copy_split->lengths[sVar47] = uVar49;
          sVar47 = sVar47 + 1;
          uVar49 = 0;
        }
        uVar32 = uVar32 + 1;
      } while (uVar48 != uVar32);
      insert_and_copy_split->num_blocks = sVar47;
      insert_and_copy_split->num_types = (ulong)(uVar51 & 0xff) + 1;
      BrotliFree(m,local_fd8);
      BrotliFree(m,pvVar27);
      BrotliFree(m,local_fd0);
      BrotliFree(m,pvVar28);
    }
    BrotliFree(m,pvVar22);
    local_fe8 = BrotliAllocate(m,sVar40);
    if (num_commands != 0) {
      puVar23 = &cmds->dist_prefix_;
      local_ff8 = (HistogramCommand *)0x0;
      do {
        if (((*(uint *)(puVar23 + -5) & 0xffffff) != 0) && (0x7f < puVar23[-1])) {
          *(uint16_t *)((long)local_fe8 + (long)local_ff8 * 2) = *puVar23;
          local_ff8 = (HistogramCommand *)((long)local_ff8 + 1);
        }
        puVar23 = puVar23 + 8;
        num_commands = num_commands - 1;
      } while (num_commands != 0);
      uVar32 = 0x32;
      if (local_ff8 < 0x6a40) {
        uVar32 = (ulong)(((uint)local_ff8 & 0xffff) / 0x220 + 1);
      }
      if (local_ff8 != (HistogramCommand *)0x0) {
        if (local_ff8 < 0x80) {
          sVar40 = dist_split->num_blocks;
          uVar56 = dist_split->types_alloc_size;
          uVar32 = sVar40 + 1;
          if (uVar56 < uVar32) {
            if (uVar56 == 0) {
              uVar56 = uVar32;
            }
            do {
              uVar48 = uVar56;
              uVar56 = uVar48 * 2;
            } while (uVar48 < uVar32);
            puVar18 = (uint8_t *)BrotliAllocate(m,uVar48);
            if (dist_split->types_alloc_size != 0) {
              memcpy(puVar18,dist_split->types,dist_split->types_alloc_size);
            }
            BrotliFree(m,dist_split->types);
            dist_split->types = puVar18;
            dist_split->types_alloc_size = uVar48;
            sVar40 = dist_split->num_blocks;
            uVar32 = sVar40 + 1;
          }
          uVar56 = dist_split->lengths_alloc_size;
          if (uVar56 < uVar32) {
            if (uVar56 == 0) {
              uVar56 = uVar32;
            }
            do {
              uVar48 = uVar56;
              uVar56 = uVar48 * 2;
            } while (uVar48 < uVar32);
            puVar19 = (uint32_t *)BrotliAllocate(m,uVar48 * 4);
            if (dist_split->lengths_alloc_size != 0) {
              memcpy(puVar19,dist_split->lengths,dist_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,dist_split->lengths);
            dist_split->lengths = puVar19;
            dist_split->lengths_alloc_size = uVar48;
            sVar40 = dist_split->num_blocks;
          }
          dist_split->num_types = 1;
          dist_split->types[sVar40] = '\0';
          sVar40 = dist_split->num_blocks;
          dist_split->lengths[sVar40] = (uint)local_ff8;
          dist_split->num_blocks = sVar40 + 1;
        }
        else {
          pvVar22 = BrotliAllocate(m,uVar32 * 0x830);
          lVar53 = 0;
          do {
            memset((void *)((long)pvVar22 + lVar53),0,0x828);
            *(undefined8 *)((long)pvVar22 + lVar53 + 0x828) = 0x7ff0000000000000;
            lVar53 = lVar53 + 0x830;
          } while (uVar32 * 0x830 - lVar53 != 0);
          uVar48 = 0;
          uVar56 = 7;
          do {
            uVar25 = (uVar48 * (long)local_ff8) / uVar32;
            if (uVar48 != 0) {
              iVar122 = (int)uVar56;
              uVar56 = (ulong)(uint)(iVar122 * 0x41a7);
              if (iVar122 == 0) {
                uVar56 = 1;
              }
              uVar25 = uVar25 + uVar56 % ((ulong)local_ff8 / uVar32);
            }
            if (local_ff8 <= uVar25 + 0x28) {
              uVar25 = (long)local_ff8 - 0x29;
            }
            plVar2 = (long *)((long)pvVar22 + uVar48 * 0x830 + 0x820);
            *plVar2 = *plVar2 + 0x28;
            lVar53 = 0;
            do {
              piVar1 = (int *)((long)pvVar22 +
                              (ulong)*(ushort *)((long)local_fe8 + lVar53 * 2 + uVar25 * 2) * 4 +
                              uVar48 * 0x830);
              *piVar1 = *piVar1 + 1;
              lVar53 = lVar53 + 1;
            } while (lVar53 != 0x28);
            uVar48 = uVar48 + 1;
          } while (uVar48 != uVar32);
          uVar56 = (ulong)((long)local_ff8 * 2) / 0x28 + uVar32 + 99;
          if (uVar56 != uVar56 % uVar32) {
            uVar25 = 7;
            uVar48 = 0;
            do {
              memset(local_b40,0,0x828);
              uVar51 = (int)uVar25 * 0x41a7;
              if ((int)uVar25 == 0) {
                uVar51 = 1;
              }
              uVar25 = (ulong)uVar51;
              puVar26 = (ushort *)((long)local_fe8 + (uVar25 % ((long)local_ff8 - 0x27U)) * 2);
              lVar53 = -0x28;
              do {
                uVar16 = *puVar26;
                puVar26 = puVar26 + 1;
                *(int *)(local_b40 + (ulong)uVar16 * 4) =
                     *(int *)(local_b40 + (ulong)uVar16 * 4) + 1;
                lVar53 = lVar53 + 1;
              } while (lVar53 != 0);
              lVar53 = (uVar48 % uVar32) * 0x830;
              plVar2 = (long *)((long)pvVar22 + lVar53 + 0x820);
              *plVar2 = *plVar2 + 0x28;
              lVar36 = 0;
              do {
                lVar31 = lVar36 * 4;
                piVar1 = (int *)((long)pvVar22 + lVar36 * 4 + lVar53);
                auVar71._0_4_ = *piVar1 + *(int *)(local_b40 + lVar31);
                auVar71._4_4_ = piVar1[1] + *(int *)(local_b40 + lVar31 + 4);
                auVar71._8_4_ = piVar1[2] + *(int *)(local_b40 + lVar31 + 8);
                auVar71._12_4_ = piVar1[3] + *(int *)(local_b40 + lVar31 + 0xc);
                *(undefined1 (*) [16])((long)pvVar22 + lVar36 * 4 + lVar53) = auVar71;
                lVar36 = lVar36 + 4;
              } while (lVar36 != 0x208);
              uVar48 = uVar48 + 1;
            } while (uVar48 < uVar56 - uVar56 % uVar32);
          }
          pvVar27 = BrotliAllocate(m,(size_t)local_ff8);
          iVar122 = (int)uVar32;
          pvVar28 = BrotliAllocate(m,uVar32 * 0x1040);
          pvVar29 = BrotliAllocate(m,(ulong)(uint)(iVar122 * 8));
          sVar40 = (ulong)(iVar122 + 7U >> 3) * (long)local_ff8;
          if (sVar40 == 0) {
            local_f90 = (void *)0x0;
          }
          else {
            local_f90 = BrotliAllocate(m,sVar40);
          }
          pvVar30 = BrotliAllocate(m,(ulong)(uint)(iVar122 * 2));
          lVar53 = 3;
          if (10 < params->quality) {
            lVar53 = 10;
          }
          lVar36 = 0;
          do {
            uVar56 = uVar32 + 7 >> 3;
            if (uVar32 < 2) {
              memset(pvVar27,0,(size_t)local_ff8);
              uVar48 = 1;
              auVar66 = _DAT_00139180;
            }
            else {
              memset(pvVar28,0,uVar32 * 0x1040);
              uVar48 = 0;
              puVar39 = (uint *)((long)pvVar22 + 0x820);
              do {
                uVar25 = (ulong)*puVar39;
                if (uVar25 < 0x100) {
                  dVar58 = (double)kLog2Table[uVar25];
                }
                else {
                  dVar58 = log2((double)uVar25);
                }
                *(double *)((long)pvVar28 + uVar48 * 8) = dVar58;
                uVar48 = uVar48 + 1;
                puVar39 = puVar39 + 0x20c;
              } while (uVar32 != uVar48);
              pvVar50 = (void *)(uVar32 * 0x1038 + (long)pvVar28);
              lVar31 = 0x208;
              puVar39 = (uint *)((long)pvVar22 + 0x81c);
              do {
                lVar31 = lVar31 + -1;
                uVar48 = 0;
                puVar41 = puVar39;
                do {
                  dVar57 = -2.0;
                  dVar58 = *(double *)((long)pvVar28 + uVar48 * 8);
                  uVar25 = (ulong)*puVar41;
                  if (uVar25 != 0) {
                    if (*puVar41 < 0x100) {
                      dVar57 = (double)kLog2Table[uVar25];
                    }
                    else {
                      dVar57 = log2((double)uVar25);
                    }
                  }
                  *(double *)((long)pvVar50 + uVar48 * 8) = dVar58 - dVar57;
                  uVar48 = uVar48 + 1;
                  puVar41 = puVar41 + 0x20c;
                } while (uVar32 != uVar48);
                pvVar50 = (void *)((long)pvVar50 + uVar32 * -8);
                puVar39 = puVar39 + -1;
              } while (lVar31 != 0);
              memset(pvVar29,0,uVar32 * 8);
              memset(local_f90,0,uVar56 * (long)local_ff8);
              auVar66 = _DAT_00139180;
              uVar48 = 0;
              do {
                uVar16 = *(ushort *)((long)local_fe8 + uVar48 * 2);
                uVar25 = 0;
                dVar58 = 1e+99;
                do {
                  dVar57 = *(double *)((long)pvVar28 + uVar25 * 8 + uVar16 * uVar32 * 8) +
                           *(double *)((long)pvVar29 + uVar25 * 8);
                  *(double *)((long)pvVar29 + uVar25 * 8) = dVar57;
                  if (dVar57 < dVar58) {
                    *(char *)((long)pvVar27 + uVar48) = (char)uVar25;
                    dVar58 = dVar57;
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar32 != uVar25);
                dVar57 = 14.6;
                if (uVar48 < 2000) {
                  dVar57 = (((double)(long)uVar48 * 0.07) / 2000.0 + 0.77) * 14.6;
                }
                uVar25 = 0;
                do {
                  dVar74 = *(double *)((long)pvVar29 + uVar25 * 8) - dVar58;
                  *(double *)((long)pvVar29 + uVar25 * 8) = dVar74;
                  if (dVar57 <= dVar74) {
                    *(double *)((long)pvVar29 + uVar25 * 8) = dVar57;
                    if (uVar56 <= uVar25 >> 3) {
                      pcVar37 = 
                      "size_t FindBlocksDistance(const uint16_t *, const size_t, const double, const size_t, const HistogramDistance *, double *, double *, uint8_t *, uint8_t *)"
                      ;
LAB_001160d6:
                      __assert_fail("(k >> 3) < bitmaplen",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                                    ,0x82,pcVar37);
                    }
                    pbVar38 = (byte *)((long)local_f90 + (uVar25 >> 3) + uVar48 * uVar56);
                    *pbVar38 = *pbVar38 | '\x01' << ((byte)uVar25 & 7);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar32 != uVar25);
                uVar48 = uVar48 + 1;
              } while ((HistogramCommand *)uVar48 != local_ff8);
              bVar44 = *(byte *)((long)pvVar27 + ((long)local_ff8 - 1U));
              pvVar50 = (void *)(((long)local_ff8 - 2U) * uVar56 + (long)local_f90);
              uVar48 = 1;
              pHVar43 = local_ff8;
              do {
                if (uVar56 <= bVar44 >> 3) {
                  pcVar37 = 
                  "size_t FindBlocksDistance(const uint16_t *, const size_t, const double, const size_t, const HistogramDistance *, double *, double *, uint8_t *, uint8_t *)"
                  ;
LAB_001161bd:
                  __assert_fail("((size_t)cur_id >> 3) < bitmaplen",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                                ,0x8d,pcVar37);
                }
                if ((*(byte *)((long)pvVar50 + (ulong)(bVar44 >> 3)) >> (bVar44 & 7) & 1) != 0) {
                  bVar46 = *(byte *)((long)pvVar27 + ((long)pHVar43 - 2U));
                  uVar48 = uVar48 + (bVar44 != bVar46);
                  bVar44 = bVar46;
                }
                *(byte *)((long)pvVar27 + ((long)pHVar43 - 2U)) = bVar44;
                pvVar50 = (void *)((long)pvVar50 - uVar56);
                pHVar43 = (HistogramCommand *)((long)pHVar43 - 1);
              } while (pHVar43 != (HistogramCommand *)0x1);
            }
            if (uVar32 != 0) {
              lVar31 = uVar32 - 1;
              auVar62._8_4_ = (int)lVar31;
              auVar62._0_8_ = lVar31;
              auVar62._12_4_ = (int)((ulong)lVar31 >> 0x20);
              auVar62 = auVar62 ^ auVar66;
              lVar31 = 0;
              auVar72 = _DAT_00139170;
              auVar76 = _DAT_00139160;
              auVar78 = _DAT_00139f40;
              auVar80 = _DAT_00139f30;
              do {
                auVar97 = auVar72 ^ auVar66;
                iVar122 = auVar62._0_4_;
                iVar121 = -(uint)(iVar122 < auVar97._0_4_);
                iVar64 = auVar62._4_4_;
                auVar99._4_4_ = -(uint)(iVar64 < auVar97._4_4_);
                iVar130 = auVar62._8_4_;
                iVar129 = -(uint)(iVar130 < auVar97._8_4_);
                iVar65 = auVar62._12_4_;
                auVar99._12_4_ = -(uint)(iVar65 < auVar97._12_4_);
                auVar116._4_4_ = iVar121;
                auVar116._0_4_ = iVar121;
                auVar116._8_4_ = iVar129;
                auVar116._12_4_ = iVar129;
                auVar135 = pshuflw(in_XMM8,auVar116,0xe8);
                auVar98._4_4_ = -(uint)(auVar97._4_4_ == iVar64);
                auVar98._12_4_ = -(uint)(auVar97._12_4_ == iVar65);
                auVar98._0_4_ = auVar98._4_4_;
                auVar98._8_4_ = auVar98._12_4_;
                auVar139 = pshuflw(in_XMM9,auVar98,0xe8);
                auVar99._0_4_ = auVar99._4_4_;
                auVar99._8_4_ = auVar99._12_4_;
                auVar97 = pshuflw(auVar135,auVar99,0xe8);
                auVar136._8_4_ = 0xffffffff;
                auVar136._0_8_ = 0xffffffffffffffff;
                auVar136._12_4_ = 0xffffffff;
                auVar136 = (auVar97 | auVar139 & auVar135) ^ auVar136;
                auVar97 = packssdw(auVar136,auVar136);
                if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31) = 0x100;
                }
                auVar99 = auVar98 & auVar116 | auVar99;
                auVar97 = packssdw(auVar99,auVar99);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar97 = packssdw(auVar97 ^ auVar6,auVar97 ^ auVar6);
                if ((auVar97._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 2) = 0x100;
                }
                auVar97 = auVar76 ^ auVar66;
                iVar121 = -(uint)(iVar122 < auVar97._0_4_);
                auVar127._4_4_ = -(uint)(iVar64 < auVar97._4_4_);
                iVar129 = -(uint)(iVar130 < auVar97._8_4_);
                auVar127._12_4_ = -(uint)(iVar65 < auVar97._12_4_);
                auVar100._4_4_ = iVar121;
                auVar100._0_4_ = iVar121;
                auVar100._8_4_ = iVar129;
                auVar100._12_4_ = iVar129;
                auVar117._4_4_ = -(uint)(auVar97._4_4_ == iVar64);
                auVar117._12_4_ = -(uint)(auVar97._12_4_ == iVar65);
                auVar117._0_4_ = auVar117._4_4_;
                auVar117._8_4_ = auVar117._12_4_;
                auVar127._0_4_ = auVar127._4_4_;
                auVar127._8_4_ = auVar127._12_4_;
                auVar97 = auVar117 & auVar100 | auVar127;
                auVar97 = packssdw(auVar97,auVar97);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar97 = packssdw(auVar97 ^ auVar7,auVar97 ^ auVar7);
                if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 4) = 0x100;
                }
                auVar101 = pshufhw(auVar100,auVar100,0x84);
                auVar118 = pshufhw(auVar117,auVar117,0x84);
                auVar102 = pshufhw(auVar101,auVar127,0x84);
                auVar103._8_4_ = 0xffffffff;
                auVar103._0_8_ = 0xffffffffffffffff;
                auVar103._12_4_ = 0xffffffff;
                auVar103 = (auVar102 | auVar118 & auVar101) ^ auVar103;
                auVar101 = packssdw(auVar103,auVar103);
                if ((auVar101 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 6) = 0x100;
                }
                auVar101 = auVar78 ^ auVar66;
                iVar121 = -(uint)(iVar122 < auVar101._0_4_);
                auVar105._4_4_ = -(uint)(iVar64 < auVar101._4_4_);
                iVar129 = -(uint)(iVar130 < auVar101._8_4_);
                auVar105._12_4_ = -(uint)(iVar65 < auVar101._12_4_);
                auVar119._4_4_ = iVar121;
                auVar119._0_4_ = iVar121;
                auVar119._8_4_ = iVar129;
                auVar119._12_4_ = iVar129;
                auVar97 = pshuflw(auVar97,auVar119,0xe8);
                auVar104._4_4_ = -(uint)(auVar101._4_4_ == iVar64);
                auVar104._12_4_ = -(uint)(auVar101._12_4_ == iVar65);
                auVar104._0_4_ = auVar104._4_4_;
                auVar104._8_4_ = auVar104._12_4_;
                in_XMM9 = pshuflw(auVar139 & auVar135,auVar104,0xe8);
                in_XMM9 = in_XMM9 & auVar97;
                auVar105._0_4_ = auVar105._4_4_;
                auVar105._8_4_ = auVar105._12_4_;
                auVar97 = pshuflw(auVar97,auVar105,0xe8);
                auVar137._8_4_ = 0xffffffff;
                auVar137._0_8_ = 0xffffffffffffffff;
                auVar137._12_4_ = 0xffffffff;
                auVar137 = (auVar97 | in_XMM9) ^ auVar137;
                auVar97 = packssdw(auVar137,auVar137);
                if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 8) = 0x100;
                }
                auVar105 = auVar104 & auVar119 | auVar105;
                auVar97 = packssdw(auVar105,auVar105);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar97 = packssdw(auVar97 ^ auVar8,auVar97 ^ auVar8);
                if ((auVar97 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 10) = 0x100;
                }
                auVar97 = auVar80 ^ auVar66;
                iVar122 = -(uint)(iVar122 < auVar97._0_4_);
                auVar128._4_4_ = -(uint)(iVar64 < auVar97._4_4_);
                iVar130 = -(uint)(iVar130 < auVar97._8_4_);
                auVar128._12_4_ = -(uint)(iVar65 < auVar97._12_4_);
                auVar106._4_4_ = iVar122;
                auVar106._0_4_ = iVar122;
                auVar106._8_4_ = iVar130;
                auVar106._12_4_ = iVar130;
                auVar120._4_4_ = -(uint)(auVar97._4_4_ == iVar64);
                auVar120._12_4_ = -(uint)(auVar97._12_4_ == iVar65);
                auVar120._0_4_ = auVar120._4_4_;
                auVar120._8_4_ = auVar120._12_4_;
                auVar128._0_4_ = auVar128._4_4_;
                auVar128._8_4_ = auVar128._12_4_;
                auVar97 = auVar120 & auVar106 | auVar128;
                auVar97 = packssdw(auVar97,auVar97);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar97 ^ auVar9,auVar97 ^ auVar9);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 0xc) = 0x100;
                }
                auVar97 = pshufhw(auVar106,auVar106,0x84);
                auVar139 = pshufhw(auVar120,auVar120,0x84);
                auVar135 = pshufhw(auVar97,auVar128,0x84);
                auVar107._8_4_ = 0xffffffff;
                auVar107._0_8_ = 0xffffffffffffffff;
                auVar107._12_4_ = 0xffffffff;
                auVar107 = (auVar135 | auVar139 & auVar97) ^ auVar107;
                auVar97 = packssdw(auVar107,auVar107);
                if ((auVar97 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)((long)pvVar30 + lVar31 + 0xe) = 0x100;
                }
                lVar20 = auVar72._8_8_;
                auVar72._0_8_ = auVar72._0_8_ + 8;
                auVar72._8_8_ = lVar20 + 8;
                lVar20 = auVar76._8_8_;
                auVar76._0_8_ = auVar76._0_8_ + 8;
                auVar76._8_8_ = lVar20 + 8;
                lVar20 = auVar78._8_8_;
                auVar78._0_8_ = auVar78._0_8_ + 8;
                auVar78._8_8_ = lVar20 + 8;
                lVar20 = auVar80._8_8_;
                auVar80._0_8_ = auVar80._0_8_ + 8;
                auVar80._8_8_ = lVar20 + 8;
                lVar31 = lVar31 + 0x10;
              } while (uVar56 * 0x10 != lVar31);
            }
            uVar56 = 0;
            uVar16 = 0;
            do {
              uVar25 = (ulong)*(byte *)((long)pvVar27 + uVar56);
              if (uVar32 <= uVar25) {
                pcVar37 = 
                "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_00116168:
                __assert_fail("block_ids[i] < num_histograms",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                              ,0xa5,pcVar37);
              }
              if (*(short *)((long)pvVar30 + uVar25 * 2) == 0x100) {
                *(ushort *)((long)pvVar30 + uVar25 * 2) = uVar16;
                uVar16 = uVar16 + 1;
              }
              uVar56 = uVar56 + 1;
            } while (local_ff8 != (HistogramCommand *)uVar56);
            uVar25 = (ulong)uVar16;
            uVar56 = 0;
            do {
              uVar3 = *(ushort *)((long)pvVar30 + (ulong)*(byte *)((long)pvVar27 + uVar56) * 2);
              *(char *)((long)pvVar27 + uVar56) = (char)uVar3;
              if ((ushort)uVar32 <= (uVar3 & 0xff)) {
                pcVar37 = 
                "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_00116187:
                __assert_fail("block_ids[i] < num_histograms",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                              ,0xac,pcVar37);
              }
              uVar56 = uVar56 + 1;
            } while (local_ff8 != (HistogramCommand *)uVar56);
            if (uVar32 < uVar25) {
              pcVar37 = 
              "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_0011626f:
              __assert_fail("next_id <= num_histograms",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                            ,0xae,pcVar37);
            }
            if (uVar16 != 0) {
              lVar31 = 0;
              do {
                memset((void *)((long)pvVar22 + lVar31),0,0x828);
                *(undefined8 *)((long)pvVar22 + lVar31 + 0x828) = 0x7ff0000000000000;
                lVar31 = lVar31 + 0x830;
              } while (uVar25 * 0x830 - lVar31 != 0);
            }
            uVar32 = 0;
            do {
              lVar31 = (ulong)*(byte *)((long)pvVar27 + uVar32) * 0x830;
              piVar1 = (int *)((long)pvVar22 +
                              (ulong)*(ushort *)((long)local_fe8 + uVar32 * 2) * 4 + lVar31);
              *piVar1 = *piVar1 + 1;
              plVar2 = (long *)((long)pvVar22 + lVar31 + 0x820);
              *plVar2 = *plVar2 + 1;
              uVar32 = uVar32 + 1;
            } while (local_ff8 != (HistogramCommand *)uVar32);
            lVar36 = lVar36 + 1;
            uVar32 = uVar25;
          } while (lVar36 != lVar53);
          BrotliFree(m,pvVar28);
          BrotliFree(m,pvVar29);
          BrotliFree(m,local_f90);
          BrotliFree(m,pvVar30);
          BrotliFree(m,pvVar22);
          if (uVar48 == 0) {
            local_fe0 = (HistogramDistance *)BrotliAllocate(m,0x7ad0);
            local_fa8 = (uint32_t *)BrotliAllocate(m,0x3c);
            local_f70 = 0xf;
            sVar40 = 0;
            pvVar22 = (void *)0x0;
            local_fd0 = (uint32_t *)0x0;
            local_fb8 = (HistogramDistance *)0x0;
          }
          else {
            sVar40 = uVar48 * 4;
            local_fd0 = (uint32_t *)BrotliAllocate(m,sVar40);
            pvVar22 = BrotliAllocate(m,sVar40);
            uVar32 = uVar48 * 0x10 + 0x3f0;
            local_f70 = uVar32 >> 6;
            if (uVar32 < 0x40) {
              local_fa8 = (uint32_t *)0x0;
              local_fe0 = (HistogramDistance *)0x0;
            }
            else {
              local_fe0 = (HistogramDistance *)BrotliAllocate(m,local_f70 * 0x830);
              local_fa8 = (uint32_t *)BrotliAllocate(m,local_f70 * 4);
            }
            uVar32 = 0x40;
            if (uVar48 < 0x40) {
              uVar32 = uVar48;
            }
            local_fb8 = (HistogramDistance *)BrotliAllocate(m,uVar32 * 0x830);
          }
          local_f80 = (HistogramPair *)BrotliAllocate(m,0xc018);
          uVar56 = 0;
          memset(sizes,0,0x100);
          memset(new_clusters,0,0x100);
          memset(symbols,0,0x100);
          memset(remap,0,0x100);
          memset(pvVar22,0,sVar40);
          uVar32 = 0;
          do {
            if (uVar48 <= uVar56) {
              pcVar37 = 
              "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
              ;
LAB_0011628e:
              __assert_fail("block_idx < num_blocks",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                            ,0xe7,pcVar37);
            }
            piVar1 = (int *)((long)pvVar22 + uVar56 * 4);
            *piVar1 = *piVar1 + 1;
            if (((long)local_ff8 - 1U == uVar32) ||
               (*(char *)((long)pvVar27 + uVar32) != *(char *)((long)pvVar27 + uVar32 + 1))) {
              uVar56 = uVar56 + 1;
            }
            uVar32 = uVar32 + 1;
          } while (local_ff8 != (HistogramCommand *)uVar32);
          if (uVar56 != uVar48) {
            pcVar37 = 
            "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
            ;
LAB_001162fa:
            __assert_fail("block_idx == num_blocks",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                          ,0xed,pcVar37);
          }
          local_f90 = (void *)local_f70;
          local_ff0 = 0;
          local_fc8 = 0.0;
          puVar19 = local_fd0;
          uVar32 = uVar48;
          uVar56 = 0;
          do {
            uVar25 = 0x40;
            if (uVar32 < 0x40) {
              uVar25 = uVar32;
            }
            lVar53 = uVar25 + (uVar25 == 0);
            lVar36 = 0;
            do {
              pHVar33 = local_fb8 + lVar36;
              memset(pHVar33,0,0x828);
              local_fb8[lVar36].bit_cost_ = INFINITY;
              if (*(int *)((long)pvVar22 + (local_ff0 + lVar36) * 4) != 0) {
                uVar25 = 0;
                do {
                  pHVar33->data_[*(ushort *)((long)local_fe8 + uVar25 * 2 + (long)local_fc8 * 2)] =
                       pHVar33->data_
                       [*(ushort *)((long)local_fe8 + uVar25 * 2 + (long)local_fc8 * 2)] + 1;
                  uVar25 = uVar25 + 1;
                } while (uVar25 < *(uint *)((long)pvVar22 + (local_ff0 + lVar36) * 4));
                pHVar33->total_count_ = uVar25;
                local_fc8 = (double)((long)local_fc8 + uVar25);
              }
              dVar58 = BrotliPopulationCostDistance(pHVar33);
              pHVar33->bit_cost_ = dVar58;
              new_clusters[lVar36] = (uint32_t)lVar36;
              symbols[lVar36] = (uint32_t)lVar36;
              sizes[lVar36] = 1;
              lVar36 = lVar36 + 1;
            } while (lVar36 != lVar53);
            sVar40 = uVar48 - local_ff0;
            if (0x3f < sVar40) {
              sVar40 = 0x40;
            }
            sVar40 = BrotliHistogramCombineDistance
                               (local_fb8,sizes,symbols,new_clusters,local_f80,sVar40,sVar40,0x40,
                                0x800);
            uVar25 = sVar40 + uVar56;
            if (local_f70 < uVar25) {
              uVar55 = local_f70;
              if (local_f70 == 0) {
                uVar55 = uVar25;
              }
              do {
                uVar52 = uVar55;
                uVar55 = uVar52 * 2;
              } while (uVar52 < uVar25);
              pHVar33 = (HistogramDistance *)BrotliAllocate(m,uVar52 * 0x830);
              if (local_f70 != 0) {
                memcpy(pHVar33,local_fe0,local_f70 * 0x830);
              }
              BrotliFree(m,local_fe0);
              local_fe0 = pHVar33;
              local_f70 = uVar52;
            }
            if (local_f90 < uVar25) {
              pvVar28 = local_f90;
              if (local_f90 == (void *)0x0) {
                pvVar28 = (void *)uVar25;
              }
              do {
                uVar55 = (ulong)pvVar28;
                pvVar28 = (void *)(uVar55 * 2);
              } while (uVar55 < uVar25);
              puVar34 = (uint32_t *)BrotliAllocate(m,uVar55 * 4);
              if (local_f90 != (void *)0x0) {
                memcpy(puVar34,local_fa8,(long)local_f90 << 2);
              }
              BrotliFree(m,local_fa8);
              local_fa8 = puVar34;
              local_f90 = (void *)uVar55;
            }
            uVar55 = uVar56;
            if (sVar40 != 0) {
              pHVar33 = local_fe0 + uVar56;
              sVar47 = 0;
              do {
                uVar51 = new_clusters[sVar47];
                memcpy(pHVar33,local_fb8 + uVar51,0x830);
                local_fa8[uVar56 + sVar47] = sizes[uVar51];
                remap[new_clusters[sVar47]] = (uint32_t)sVar47;
                sVar47 = sVar47 + 1;
                pHVar33 = pHVar33 + 1;
              } while (sVar40 != sVar47);
              uVar55 = sVar47 + uVar56;
            }
            lVar36 = 0;
            do {
              puVar19[lVar36] = remap[symbols[lVar36]] + (int)uVar56;
              lVar36 = lVar36 + 1;
            } while (lVar53 != lVar36);
            if (uVar25 != uVar55) {
              pcVar37 = 
              "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
              ;
LAB_001162ad:
              __assert_fail("num_clusters == cluster_size_size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                            ,0x111,pcVar37);
            }
            local_ff0 = local_ff0 + 0x40;
            uVar32 = uVar32 - 0x40;
            puVar19 = puVar19 + 0x40;
            uVar56 = uVar25;
          } while (local_ff0 < uVar48);
          BrotliFree(m,local_fb8);
          uVar32 = (uVar25 >> 1) * uVar25;
          if (uVar25 * 0x40 < uVar32) {
            uVar32 = uVar25 * 0x40;
          }
          if (0x800 < uVar32) {
            BrotliFree(m,local_f80);
            local_f80 = (HistogramPair *)BrotliAllocate(m,uVar32 * 0x18 + 0x18);
          }
          if (uVar25 == 0) {
            puVar19 = (uint32_t *)0x0;
          }
          else {
            puVar19 = (uint32_t *)BrotliAllocate(m,uVar25 * 4);
            auVar66 = _DAT_00139180;
            lVar53 = uVar25 - 1;
            auVar63._8_4_ = (int)lVar53;
            auVar63._0_8_ = lVar53;
            auVar63._12_4_ = (int)((ulong)lVar53 >> 0x20);
            uVar56 = 0;
            auVar63 = auVar63 ^ _DAT_00139180;
            auVar73 = _DAT_00139170;
            do {
              auVar97 = auVar73 ^ auVar66;
              if ((bool)(~(auVar97._4_4_ == auVar63._4_4_ && auVar63._0_4_ < auVar97._0_4_ ||
                          auVar63._4_4_ < auVar97._4_4_) & 1)) {
                puVar19[uVar56] = (uint32_t)uVar56;
              }
              if ((auVar97._12_4_ != auVar63._12_4_ || auVar97._8_4_ <= auVar63._8_4_) &&
                  auVar97._12_4_ <= auVar63._12_4_) {
                puVar19[uVar56 + 1] = (uint32_t)uVar56 + 1;
              }
              uVar56 = uVar56 + 2;
              lVar53 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + 2;
              auVar73._8_8_ = lVar53 + 2;
            } while ((uVar25 + 1 & 0xfffffffffffffffe) != uVar56);
          }
          sVar40 = BrotliHistogramCombineDistance
                             (local_fe0,local_fa8,local_fd0,puVar19,local_f80,uVar25,uVar48,0x100,
                              uVar32);
          BrotliFree(m,local_f80);
          BrotliFree(m,local_fa8);
          iVar122 = 0;
          if (uVar25 == 0) {
            local_fd8 = (void *)0x0;
          }
          else {
            local_fd8 = BrotliAllocate(m,uVar25 * 4);
            memset(local_fd8,0xff,uVar25 * 4);
          }
          uVar32 = 0;
          local_ff0 = 0;
          do {
            memset(local_b40,0,0x828);
            local_318 = INFINITY;
            if (*(int *)((long)pvVar22 + uVar32 * 4) != 0) {
              uVar56 = 0;
              do {
                *(int *)(local_b40 +
                        (ulong)*(ushort *)((long)local_fe8 + uVar56 * 2 + local_ff0 * 2) * 4) =
                     *(int *)(local_b40 +
                             (ulong)*(ushort *)((long)local_fe8 + uVar56 * 2 + local_ff0 * 2) * 4) +
                     1;
                uVar56 = uVar56 + 1;
              } while (uVar56 < *(uint *)((long)pvVar22 + uVar32 * 4));
              local_ff0 = local_ff0 + uVar56;
              local_320 = uVar56;
            }
            lVar53 = 0;
            if (uVar32 != 0) {
              lVar53 = uVar32 - 1;
            }
            uVar51 = local_fd0[lVar53];
            uVar56 = (ulong)uVar51;
            local_fc8 = BrotliHistogramBitCostDistanceDistance
                                  ((HistogramDistance *)local_b40,local_fe0 + uVar56);
            if (sVar40 != 0) {
              sVar47 = 0;
              do {
                dVar58 = BrotliHistogramBitCostDistanceDistance
                                   ((HistogramDistance *)local_b40,local_fe0 + puVar19[sVar47]);
                if (dVar58 < local_fc8) {
                  uVar56 = (ulong)puVar19[sVar47];
                  local_fc8 = dVar58;
                }
                uVar51 = (uint)uVar56;
                sVar47 = sVar47 + 1;
              } while (sVar40 != sVar47);
            }
            local_fd0[uVar32] = uVar51;
            if (*(int *)((long)local_fd8 + uVar56 * 4) == -1) {
              *(int *)((long)local_fd8 + uVar56 * 4) = iVar122;
              iVar122 = iVar122 + 1;
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar48);
          BrotliFree(m,puVar19);
          BrotliFree(m,local_fe0);
          uVar32 = dist_split->types_alloc_size;
          if (uVar32 < uVar48) {
            if (uVar32 == 0) {
              uVar32 = uVar48;
            }
            do {
              uVar56 = uVar32;
              uVar32 = uVar56 * 2;
            } while (uVar56 < uVar48);
            puVar18 = (uint8_t *)BrotliAllocate(m,uVar56);
            if (dist_split->types_alloc_size != 0) {
              memcpy(puVar18,dist_split->types,dist_split->types_alloc_size);
            }
            BrotliFree(m,dist_split->types);
            dist_split->types = puVar18;
            dist_split->types_alloc_size = uVar56;
          }
          uVar32 = dist_split->lengths_alloc_size;
          if (uVar32 < uVar48) {
            if (uVar32 == 0) {
              uVar32 = uVar48;
            }
            do {
              uVar56 = uVar32;
              uVar32 = uVar56 * 2;
            } while (uVar56 < uVar48);
            puVar19 = (uint32_t *)BrotliAllocate(m,uVar56 * 4);
            if (dist_split->lengths_alloc_size != 0) {
              memcpy(puVar19,dist_split->lengths,dist_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,dist_split->lengths);
            dist_split->lengths = puVar19;
            dist_split->lengths_alloc_size = uVar56;
          }
          sVar40 = 0;
          uVar49 = 0;
          uVar32 = 0;
          uVar51 = 0;
          do {
            uVar49 = uVar49 + *(int *)((long)pvVar22 + uVar32 * 4);
            if ((uVar48 - 1 == uVar32) || (local_fd0[uVar32] != local_fd0[uVar32 + 1])) {
              uVar45 = uVar51 & 0xff;
              uVar4 = *(uint *)((long)local_fd8 + (ulong)local_fd0[uVar32] * 4);
              bVar46 = (byte)uVar4;
              dist_split->types[sVar40] = bVar46;
              bVar44 = (byte)uVar51;
              uVar51 = uVar4;
              if (bVar46 < bVar44) {
                uVar51 = uVar45;
              }
              dist_split->lengths[sVar40] = uVar49;
              sVar40 = sVar40 + 1;
              uVar49 = 0;
            }
            uVar32 = uVar32 + 1;
          } while (uVar48 != uVar32);
          dist_split->num_blocks = sVar40;
          dist_split->num_types = (ulong)(uVar51 & 0xff) + 1;
          BrotliFree(m,local_fd8);
          BrotliFree(m,pvVar22);
          BrotliFree(m,local_fd0);
          BrotliFree(m,pvVar27);
        }
        goto LAB_00114d28;
      }
    }
  }
  dist_split->num_types = 1;
LAB_00114d28:
  BrotliFree(m,local_fe8);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
       Literal histograms have alphabet size 256. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}